

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  long lVar5;
  RTCRayQueryContext *pRVar6;
  long lVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  uint uVar66;
  long lVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  bool bVar73;
  float fVar74;
  float fVar102;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar75;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar87 [32];
  float fVar106;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar103;
  float fVar105;
  float fVar107;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar82 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar85 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar111;
  float fVar137;
  float fVar138;
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  float fVar139;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar140;
  float fVar156;
  float fVar157;
  vint4 ai;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar161;
  float fVar163;
  float fVar165;
  undefined1 auVar147 [32];
  float fVar159;
  undefined1 auVar148 [32];
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar164;
  float fVar166;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar146 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar167;
  float fVar187;
  float fVar188;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar195;
  float fVar215;
  float fVar216;
  vint4 bi;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [28];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar221;
  float fVar222;
  float fVar242;
  float fVar244;
  vint4 ai_2;
  undefined1 auVar223 [16];
  float fVar246;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  float fVar248;
  float fVar249;
  undefined1 auVar232 [32];
  float fVar243;
  float fVar245;
  float fVar247;
  float fVar250;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar251;
  float fVar268;
  float fVar272;
  vint4 ai_1;
  undefined1 auVar255 [16];
  float fVar276;
  undefined1 auVar256 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [28];
  float fVar280;
  float fVar283;
  undefined1 auVar261 [32];
  float fVar269;
  float fVar270;
  float fVar273;
  float fVar274;
  float fVar277;
  float fVar278;
  float fVar281;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar289;
  undefined1 auVar262 [32];
  float fVar271;
  float fVar275;
  float fVar279;
  float fVar282;
  float fVar285;
  float fVar288;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar293 [16];
  undefined1 auVar292 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [16];
  float fVar302;
  float fVar303;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar307;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar310 [64];
  float fVar317;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [64];
  float fVar330;
  float fVar335;
  float fVar336;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar342;
  float fVar349;
  float fVar351;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar343;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar362 [16];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [64];
  undefined1 auVar366 [28];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d04;
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_bd0 [8];
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_bb0 [8];
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 (*local_ab8) [16];
  undefined1 (*local_ab0) [16];
  undefined1 (*local_aa8) [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  Primitive *local_928;
  ulong local_920;
  undefined1 auStack_918 [24];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar2 = prim[1];
  uVar72 = (ulong)(byte)PVar2;
  auVar114 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar114 = vsubps_avx(auVar114,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar221 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar82._0_4_ = fVar221 * auVar114._0_4_;
  auVar82._4_4_ = fVar221 * auVar114._4_4_;
  auVar82._8_4_ = fVar221 * auVar114._8_4_;
  auVar82._12_4_ = fVar221 * auVar114._12_4_;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar290._0_4_ = fVar221 * auVar8._0_4_;
  auVar290._4_4_ = fVar221 * auVar8._4_4_;
  auVar290._8_4_ = fVar221 * auVar8._8_4_;
  auVar290._12_4_ = fVar221 * auVar8._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xc + 6)));
  auVar174 = vcvtdq2ps_avx(auVar174);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xd + 6)));
  auVar257 = vcvtdq2ps_avx(auVar257);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x12 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x13 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x14 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar76 = vshufps_avx(auVar290,auVar290,0);
  auVar112 = vshufps_avx(auVar290,auVar290,0x55);
  auVar85 = vshufps_avx(auVar290,auVar290,0xaa);
  fVar221 = auVar85._0_4_;
  fVar167 = auVar85._4_4_;
  fVar242 = auVar85._8_4_;
  fVar187 = auVar85._12_4_;
  fVar251 = auVar112._0_4_;
  fVar268 = auVar112._4_4_;
  fVar272 = auVar112._8_4_;
  fVar276 = auVar112._12_4_;
  fVar244 = auVar76._0_4_;
  fVar188 = auVar76._4_4_;
  fVar246 = auVar76._8_4_;
  fVar189 = auVar76._12_4_;
  auVar331._0_4_ = fVar244 * auVar114._0_4_ + fVar251 * auVar8._0_4_ + fVar221 * auVar13._0_4_;
  auVar331._4_4_ = fVar188 * auVar114._4_4_ + fVar268 * auVar8._4_4_ + fVar167 * auVar13._4_4_;
  auVar331._8_4_ = fVar246 * auVar114._8_4_ + fVar272 * auVar8._8_4_ + fVar242 * auVar13._8_4_;
  auVar331._12_4_ = fVar189 * auVar114._12_4_ + fVar276 * auVar8._12_4_ + fVar187 * auVar13._12_4_;
  auVar344._0_4_ = fVar244 * auVar174._0_4_ + fVar251 * auVar257._0_4_ + auVar14._0_4_ * fVar221;
  auVar344._4_4_ = fVar188 * auVar174._4_4_ + fVar268 * auVar257._4_4_ + auVar14._4_4_ * fVar167;
  auVar344._8_4_ = fVar246 * auVar174._8_4_ + fVar272 * auVar257._8_4_ + auVar14._8_4_ * fVar242;
  auVar344._12_4_ = fVar189 * auVar174._12_4_ + fVar276 * auVar257._12_4_ + auVar14._12_4_ * fVar187
  ;
  auVar291._0_4_ = fVar244 * auVar80._0_4_ + fVar251 * auVar77._0_4_ + auVar113._0_4_ * fVar221;
  auVar291._4_4_ = fVar188 * auVar80._4_4_ + fVar268 * auVar77._4_4_ + auVar113._4_4_ * fVar167;
  auVar291._8_4_ = fVar246 * auVar80._8_4_ + fVar272 * auVar77._8_4_ + auVar113._8_4_ * fVar242;
  auVar291._12_4_ = fVar189 * auVar80._12_4_ + fVar276 * auVar77._12_4_ + auVar113._12_4_ * fVar187;
  auVar76 = vshufps_avx(auVar82,auVar82,0);
  auVar112 = vshufps_avx(auVar82,auVar82,0x55);
  auVar85 = vshufps_avx(auVar82,auVar82,0xaa);
  fVar221 = auVar85._0_4_;
  fVar167 = auVar85._4_4_;
  fVar242 = auVar85._8_4_;
  fVar187 = auVar85._12_4_;
  fVar251 = auVar112._0_4_;
  fVar268 = auVar112._4_4_;
  fVar272 = auVar112._8_4_;
  fVar276 = auVar112._12_4_;
  fVar244 = auVar76._0_4_;
  fVar188 = auVar76._4_4_;
  fVar246 = auVar76._8_4_;
  fVar189 = auVar76._12_4_;
  auVar196._0_4_ = fVar244 * auVar114._0_4_ + fVar251 * auVar8._0_4_ + fVar221 * auVar13._0_4_;
  auVar196._4_4_ = fVar188 * auVar114._4_4_ + fVar268 * auVar8._4_4_ + fVar167 * auVar13._4_4_;
  auVar196._8_4_ = fVar246 * auVar114._8_4_ + fVar272 * auVar8._8_4_ + fVar242 * auVar13._8_4_;
  auVar196._12_4_ = fVar189 * auVar114._12_4_ + fVar276 * auVar8._12_4_ + fVar187 * auVar13._12_4_;
  auVar112._0_4_ = fVar244 * auVar174._0_4_ + auVar14._0_4_ * fVar221 + fVar251 * auVar257._0_4_;
  auVar112._4_4_ = fVar188 * auVar174._4_4_ + auVar14._4_4_ * fVar167 + fVar268 * auVar257._4_4_;
  auVar112._8_4_ = fVar246 * auVar174._8_4_ + auVar14._8_4_ * fVar242 + fVar272 * auVar257._8_4_;
  auVar112._12_4_ = fVar189 * auVar174._12_4_ + auVar14._12_4_ * fVar187 + fVar276 * auVar257._12_4_
  ;
  auVar76._0_4_ = fVar251 * auVar77._0_4_ + auVar113._0_4_ * fVar221 + fVar244 * auVar80._0_4_;
  auVar76._4_4_ = fVar268 * auVar77._4_4_ + auVar113._4_4_ * fVar167 + fVar188 * auVar80._4_4_;
  auVar76._8_4_ = fVar272 * auVar77._8_4_ + auVar113._8_4_ * fVar242 + fVar246 * auVar80._8_4_;
  auVar76._12_4_ = fVar276 * auVar77._12_4_ + auVar113._12_4_ * fVar187 + fVar189 * auVar80._12_4_;
  auVar255._8_4_ = 0x7fffffff;
  auVar255._0_8_ = 0x7fffffff7fffffff;
  auVar255._12_4_ = 0x7fffffff;
  auVar114 = vandps_avx(auVar331,auVar255);
  auVar168._8_4_ = 0x219392ef;
  auVar168._0_8_ = 0x219392ef219392ef;
  auVar168._12_4_ = 0x219392ef;
  auVar114 = vcmpps_avx(auVar114,auVar168,1);
  auVar8 = vblendvps_avx(auVar331,auVar168,auVar114);
  auVar114 = vandps_avx(auVar344,auVar255);
  auVar114 = vcmpps_avx(auVar114,auVar168,1);
  auVar13 = vblendvps_avx(auVar344,auVar168,auVar114);
  auVar114 = vandps_avx(auVar291,auVar255);
  auVar114 = vcmpps_avx(auVar114,auVar168,1);
  auVar114 = vblendvps_avx(auVar291,auVar168,auVar114);
  auVar174 = vrcpps_avx(auVar8);
  fVar251 = auVar174._0_4_;
  auVar85._0_4_ = fVar251 * auVar8._0_4_;
  fVar268 = auVar174._4_4_;
  auVar85._4_4_ = fVar268 * auVar8._4_4_;
  fVar272 = auVar174._8_4_;
  auVar85._8_4_ = fVar272 * auVar8._8_4_;
  fVar276 = auVar174._12_4_;
  auVar85._12_4_ = fVar276 * auVar8._12_4_;
  auVar292._8_4_ = 0x3f800000;
  auVar292._0_8_ = 0x3f8000003f800000;
  auVar292._12_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar292,auVar85);
  fVar251 = fVar251 + fVar251 * auVar8._0_4_;
  fVar268 = fVar268 + fVar268 * auVar8._4_4_;
  fVar272 = fVar272 + fVar272 * auVar8._8_4_;
  fVar276 = fVar276 + fVar276 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar13);
  fVar221 = auVar8._0_4_;
  auVar223._0_4_ = fVar221 * auVar13._0_4_;
  fVar242 = auVar8._4_4_;
  auVar223._4_4_ = fVar242 * auVar13._4_4_;
  fVar244 = auVar8._8_4_;
  auVar223._8_4_ = fVar244 * auVar13._8_4_;
  fVar246 = auVar8._12_4_;
  auVar223._12_4_ = fVar246 * auVar13._12_4_;
  auVar8 = vsubps_avx(auVar292,auVar223);
  fVar221 = fVar221 + fVar221 * auVar8._0_4_;
  fVar242 = fVar242 + fVar242 * auVar8._4_4_;
  fVar244 = fVar244 + fVar244 * auVar8._8_4_;
  fVar246 = fVar246 + fVar246 * auVar8._12_4_;
  auVar8 = vrcpps_avx(auVar114);
  fVar167 = auVar8._0_4_;
  auVar169._0_4_ = fVar167 * auVar114._0_4_;
  fVar187 = auVar8._4_4_;
  auVar169._4_4_ = fVar187 * auVar114._4_4_;
  fVar188 = auVar8._8_4_;
  auVar169._8_4_ = fVar188 * auVar114._8_4_;
  fVar189 = auVar8._12_4_;
  auVar169._12_4_ = fVar189 * auVar114._12_4_;
  auVar114 = vsubps_avx(auVar292,auVar169);
  fVar167 = fVar167 + fVar167 * auVar114._0_4_;
  fVar187 = fVar187 + fVar187 * auVar114._4_4_;
  fVar188 = fVar188 + fVar188 * auVar114._8_4_;
  fVar189 = fVar189 + fVar189 * auVar114._12_4_;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar114 = vpmovsxwd_avx(auVar114);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar13 = vsubps_avx(auVar114,auVar196);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar114 = vpmovsxwd_avx(auVar8);
  auVar141._0_4_ = fVar251 * auVar13._0_4_;
  auVar141._4_4_ = fVar268 * auVar13._4_4_;
  auVar141._8_4_ = fVar272 * auVar13._8_4_;
  auVar141._12_4_ = fVar276 * auVar13._12_4_;
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar196);
  auVar197._0_4_ = fVar251 * auVar114._0_4_;
  auVar197._4_4_ = fVar268 * auVar114._4_4_;
  auVar197._8_4_ = fVar272 * auVar114._8_4_;
  auVar197._12_4_ = fVar276 * auVar114._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar72 * 0xe + 6);
  auVar114 = vpmovsxwd_avx(auVar13);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar8 = vsubps_avx(auVar114,auVar112);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar114 = vpmovsxwd_avx(auVar174);
  auVar256._0_4_ = auVar8._0_4_ * fVar221;
  auVar256._4_4_ = auVar8._4_4_ * fVar242;
  auVar256._8_4_ = auVar8._8_4_ * fVar244;
  auVar256._12_4_ = auVar8._12_4_ * fVar246;
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar112);
  auVar113._0_4_ = fVar221 * auVar114._0_4_;
  auVar113._4_4_ = fVar242 * auVar114._4_4_;
  auVar113._8_4_ = fVar244 * auVar114._8_4_;
  auVar113._12_4_ = fVar246 * auVar114._12_4_;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *(ulong *)(prim + uVar72 * 0x15 + 6);
  auVar114 = vpmovsxwd_avx(auVar257);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar76);
  auVar224._0_4_ = auVar114._0_4_ * fVar167;
  auVar224._4_4_ = auVar114._4_4_ * fVar187;
  auVar224._8_4_ = auVar114._8_4_ * fVar188;
  auVar224._12_4_ = auVar114._12_4_ * fVar189;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 6);
  auVar114 = vpmovsxwd_avx(auVar14);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar76);
  auVar80._0_4_ = auVar114._0_4_ * fVar167;
  auVar80._4_4_ = auVar114._4_4_ * fVar187;
  auVar80._8_4_ = auVar114._8_4_ * fVar188;
  auVar80._12_4_ = auVar114._12_4_ * fVar189;
  auVar114 = vpminsd_avx(auVar141,auVar197);
  auVar8 = vpminsd_avx(auVar256,auVar113);
  auVar114 = vmaxps_avx(auVar114,auVar8);
  auVar8 = vpminsd_avx(auVar224,auVar80);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar304._4_4_ = uVar1;
  auVar304._0_4_ = uVar1;
  auVar304._8_4_ = uVar1;
  auVar304._12_4_ = uVar1;
  auVar8 = vmaxps_avx(auVar8,auVar304);
  auVar114 = vmaxps_avx(auVar114,auVar8);
  local_760._0_4_ = auVar114._0_4_ * 0.99999964;
  local_760._4_4_ = auVar114._4_4_ * 0.99999964;
  local_760._8_4_ = auVar114._8_4_ * 0.99999964;
  local_760._12_4_ = auVar114._12_4_ * 0.99999964;
  auVar114 = vpmaxsd_avx(auVar141,auVar197);
  auVar8 = vpmaxsd_avx(auVar256,auVar113);
  auVar114 = vminps_avx(auVar114,auVar8);
  auVar8 = vpmaxsd_avx(auVar224,auVar80);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar142._4_4_ = uVar1;
  auVar142._0_4_ = uVar1;
  auVar142._8_4_ = uVar1;
  auVar142._12_4_ = uVar1;
  auVar8 = vminps_avx(auVar8,auVar142);
  auVar114 = vminps_avx(auVar114,auVar8);
  auVar77._0_4_ = auVar114._0_4_ * 1.0000004;
  auVar77._4_4_ = auVar114._4_4_ * 1.0000004;
  auVar77._8_4_ = auVar114._8_4_ * 1.0000004;
  auVar77._12_4_ = auVar114._12_4_ * 1.0000004;
  auVar114 = vpshufd_avx(ZEXT116((byte)PVar2),0);
  auVar8 = vpcmpgtd_avx(auVar114,_DAT_01f4ad30);
  auVar114 = vcmpps_avx(local_760,auVar77,2);
  auVar114 = vandps_avx(auVar114,auVar8);
  auVar126._16_16_ = mm_lookupmask_ps._240_16_;
  auVar126._0_16_ = mm_lookupmask_ps._240_16_;
  uVar65 = vmovmskps_avx(auVar114);
  local_500 = vblendps_avx(auVar126,ZEXT832(0) << 0x20,0x80);
  local_aa8 = (undefined1 (*) [32])&local_660;
  uVar70 = 1 << ((byte)k & 0x1f);
  local_ab0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar70 & 0xf) << 4));
  local_ab8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar70 >> 4) * 0x10);
  local_928 = prim;
LAB_0083b26a:
  uVar72 = (ulong)uVar65;
  if (uVar72 == 0) {
    return;
  }
  lVar67 = 0;
  if (uVar72 != 0) {
    for (; (uVar65 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar72 = uVar72 - 1 & uVar72;
  uVar65 = *(uint *)(local_928 + 2);
  local_920 = (ulong)*(uint *)(local_928 + lVar67 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar65].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_920);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar5 = *(long *)&pGVar3[1].time_range.upper;
  auVar114 = *(undefined1 (*) [16])(lVar5 + (long)p_Var4 * uVar71);
  auVar8 = *(undefined1 (*) [16])(lVar5 + (uVar71 + 1) * (long)p_Var4);
  auVar13 = *(undefined1 (*) [16])(lVar5 + (uVar71 + 2) * (long)p_Var4);
  lVar7 = 0;
  if (uVar72 != 0) {
    for (; (uVar72 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar174 = *(undefined1 (*) [16])(lVar5 + (uVar71 + 3) * (long)p_Var4);
  if (((uVar72 != 0) && (uVar71 = uVar72 - 1 & uVar72, uVar71 != 0)) && (lVar5 = 0, uVar71 != 0)) {
    for (; (uVar71 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  auVar257 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar14 = vinsertps_avx(auVar257,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar221 = *(float *)(ray + k * 4 + 0x80);
  auVar332._4_4_ = fVar221;
  auVar332._0_4_ = fVar221;
  auVar332._8_4_ = fVar221;
  auVar332._12_4_ = fVar221;
  fStack_a90 = fVar221;
  _local_aa0 = auVar332;
  fStack_a8c = fVar221;
  fStack_a88 = fVar221;
  fStack_a84 = fVar221;
  fVar167 = *(float *)(ray + k * 4 + 0xa0);
  auVar345._4_4_ = fVar167;
  auVar345._0_4_ = fVar167;
  auVar345._8_4_ = fVar167;
  auVar345._12_4_ = fVar167;
  fStack_810 = fVar167;
  _local_820 = auVar345;
  fStack_80c = fVar167;
  fStack_808 = fVar167;
  fStack_804 = fVar167;
  auVar257 = vunpcklps_avx(auVar332,auVar345);
  fVar242 = *(float *)(ray + k * 4 + 0xc0);
  auVar362._4_4_ = fVar242;
  auVar362._0_4_ = fVar242;
  auVar362._8_4_ = fVar242;
  auVar362._12_4_ = fVar242;
  fStack_8d0 = fVar242;
  _local_8e0 = auVar362;
  fStack_8cc = fVar242;
  fStack_8c8 = fVar242;
  fStack_8c4 = fVar242;
  _local_a30 = vinsertps_avx(auVar257,auVar362,0x28);
  auVar78._0_4_ = (auVar114._0_4_ + auVar8._0_4_ + auVar13._0_4_ + auVar174._0_4_) * 0.25;
  auVar78._4_4_ = (auVar114._4_4_ + auVar8._4_4_ + auVar13._4_4_ + auVar174._4_4_) * 0.25;
  auVar78._8_4_ = (auVar114._8_4_ + auVar8._8_4_ + auVar13._8_4_ + auVar174._8_4_) * 0.25;
  auVar78._12_4_ = (auVar114._12_4_ + auVar8._12_4_ + auVar13._12_4_ + auVar174._12_4_) * 0.25;
  auVar257 = vsubps_avx(auVar78,auVar14);
  auVar257 = vdpps_avx(auVar257,_local_a30,0x7f);
  local_a40 = vdpps_avx(_local_a30,_local_a30,0x7f);
  auVar80 = vrcpss_avx(local_a40,local_a40);
  fVar187 = auVar257._0_4_ * auVar80._0_4_ * (2.0 - local_a40._0_4_ * auVar80._0_4_);
  auVar80 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
  auVar225._0_4_ = auVar14._0_4_ + local_a30._0_4_ * auVar80._0_4_;
  auVar225._4_4_ = auVar14._4_4_ + local_a30._4_4_ * auVar80._4_4_;
  auVar225._8_4_ = auVar14._8_4_ + local_a30._8_4_ * auVar80._8_4_;
  auVar225._12_4_ = auVar14._12_4_ + local_a30._12_4_ * auVar80._12_4_;
  auVar257 = vblendps_avx(auVar225,_DAT_01f45a50,8);
  _local_ba0 = vsubps_avx(auVar114,auVar257);
  _local_bb0 = vsubps_avx(auVar13,auVar257);
  _local_bc0 = vsubps_avx(auVar8,auVar257);
  _local_bd0 = vsubps_avx(auVar174,auVar257);
  auVar114 = vshufps_avx(_local_ba0,_local_ba0,0);
  register0x00001250 = auVar114;
  _local_1e0 = auVar114;
  auVar114 = vshufps_avx(_local_ba0,_local_ba0,0x55);
  local_a60._16_16_ = auVar114;
  local_a60._0_16_ = auVar114;
  auVar114 = vshufps_avx(_local_ba0,_local_ba0,0xaa);
  local_360._16_16_ = auVar114;
  local_360._0_16_ = auVar114;
  auVar8 = vshufps_avx(_local_ba0,_local_ba0,0xff);
  auVar114 = vshufps_avx(_local_bc0,_local_bc0,0);
  auVar261._16_16_ = auVar114;
  auVar261._0_16_ = auVar114;
  auVar114 = vshufps_avx(_local_bc0,_local_bc0,0x55);
  local_9a0._16_16_ = auVar114;
  local_9a0._0_16_ = auVar114;
  auVar114 = vshufps_avx(_local_bc0,_local_bc0,0xaa);
  auVar322._16_16_ = auVar114;
  auVar322._0_16_ = auVar114;
  auVar114 = vshufps_avx(_local_bc0,_local_bc0,0xff);
  local_9e0._16_16_ = auVar114;
  local_9e0._0_16_ = auVar114;
  auVar114 = vshufps_avx(_local_bb0,_local_bb0,0);
  local_380._16_16_ = auVar114;
  local_380._0_16_ = auVar114;
  auVar114 = vshufps_avx(_local_bb0,_local_bb0,0x55);
  local_3a0._16_16_ = auVar114;
  local_3a0._0_16_ = auVar114;
  auVar114 = vshufps_avx(_local_bb0,_local_bb0,0xaa);
  register0x00001290 = auVar114;
  _local_200 = auVar114;
  auVar114 = vshufps_avx(_local_bb0,_local_bb0,0xff);
  auVar267 = ZEXT3264(local_9e0);
  register0x00001290 = auVar114;
  _local_220 = auVar114;
  auVar114 = vshufps_avx(_local_bd0,_local_bd0,0);
  register0x00001290 = auVar114;
  _local_240 = auVar114;
  auVar114 = vshufps_avx(_local_bd0,_local_bd0,0x55);
  register0x00001290 = auVar114;
  _local_260 = auVar114;
  auVar114 = vshufps_avx(_local_bd0,_local_bd0,0xaa);
  register0x00001290 = auVar114;
  _local_280 = auVar114;
  auVar114 = vshufps_avx(_local_bd0,_local_bd0,0xff);
  register0x00001290 = auVar114;
  _local_2a0 = auVar114;
  auVar114 = ZEXT416((uint)(fVar221 * fVar221 + fVar167 * fVar167 + fVar242 * fVar242));
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  local_2c0._16_16_ = auVar114;
  local_2c0._0_16_ = auVar114;
  fVar221 = *(float *)(ray + k * 4 + 0x60);
  local_940 = ZEXT416((uint)fVar187);
  auVar365 = ZEXT3264(local_9a0);
  auVar114 = vshufps_avx(ZEXT416((uint)(fVar221 - fVar187)),ZEXT416((uint)(fVar221 - fVar187)),0);
  local_3c0._16_16_ = auVar114;
  local_3c0._0_16_ = auVar114;
  auVar114 = vpshufd_avx(ZEXT416(uVar65),0);
  local_5c0._16_16_ = auVar114;
  local_5c0._0_16_ = auVar114;
  auVar114 = vpshufd_avx(ZEXT416(*(uint *)(local_928 + lVar67 * 4 + 6)),0);
  local_5e0._16_16_ = auVar114;
  local_5e0._0_16_ = auVar114;
  register0x00001210 = auVar80;
  _local_900 = auVar80;
  uVar71 = 0;
  local_d04 = 1;
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  local_5a0 = vandps_avx(local_2c0,auVar87);
  auVar114 = vsqrtss_avx(local_a40,local_a40);
  auVar13 = vsqrtss_avx(local_a40,local_a40);
  auVar310 = ZEXT3264(local_a60);
  local_750 = ZEXT816(0x3f80000000000000);
  local_580 = auVar261;
  local_b20 = auVar322;
  do {
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar232._16_4_ = 0x3f800000;
    auVar232._20_4_ = 0x3f800000;
    auVar232._24_4_ = 0x3f800000;
    auVar232._28_4_ = 0x3f800000;
    auVar174 = vmovshdup_avx(local_750);
    auVar14 = vsubps_avx(auVar174,local_750);
    auVar174 = vshufps_avx(local_750,local_750,0);
    local_860._16_16_ = auVar174;
    local_860._0_16_ = auVar174;
    auVar257 = vshufps_avx(auVar14,auVar14,0);
    fVar111 = auVar257._0_4_;
    fVar137 = auVar257._4_4_;
    fVar138 = auVar257._8_4_;
    fVar139 = auVar257._12_4_;
    fVar74 = auVar174._0_4_;
    auVar127._0_4_ = fVar74 + fVar111 * 0.0;
    fVar102 = auVar174._4_4_;
    auVar127._4_4_ = fVar102 + fVar137 * 0.14285715;
    fVar104 = auVar174._8_4_;
    auVar127._8_4_ = fVar104 + fVar138 * 0.2857143;
    fVar106 = auVar174._12_4_;
    auVar127._12_4_ = fVar106 + fVar139 * 0.42857146;
    auVar127._16_4_ = fVar74 + fVar111 * 0.5714286;
    auVar127._20_4_ = fVar102 + fVar137 * 0.71428573;
    auVar127._24_4_ = fVar104 + fVar138 * 0.8571429;
    auVar127._28_4_ = fVar106 + fVar139;
    auVar126 = vsubps_avx(auVar232,auVar127);
    fVar242 = auVar126._0_4_;
    fVar187 = auVar126._4_4_;
    fVar244 = auVar126._8_4_;
    fVar188 = auVar126._12_4_;
    fVar246 = auVar126._16_4_;
    fVar189 = auVar126._20_4_;
    fVar251 = auVar126._24_4_;
    fVar194 = auVar267._28_4_ + auVar261._28_4_ + auVar322._28_4_ + 1.0 + 1.0;
    fVar167 = local_360._28_4_;
    fVar252 = local_380._0_4_ * auVar127._0_4_ + auVar261._0_4_ * fVar242;
    fVar269 = local_380._4_4_ * auVar127._4_4_ + auVar261._4_4_ * fVar187;
    fVar273 = local_380._8_4_ * auVar127._8_4_ + auVar261._8_4_ * fVar244;
    fVar277 = local_380._12_4_ * auVar127._12_4_ + auVar261._12_4_ * fVar188;
    fVar280 = local_380._16_4_ * auVar127._16_4_ + auVar261._16_4_ * fVar246;
    fVar283 = local_380._20_4_ * auVar127._20_4_ + auVar261._20_4_ * fVar189;
    fVar286 = local_380._24_4_ * auVar127._24_4_ + auVar261._24_4_ * fVar251;
    fVar268 = local_3a0._0_4_ * auVar127._0_4_ + auVar365._0_4_ * fVar242;
    fVar272 = local_3a0._4_4_ * auVar127._4_4_ + auVar365._4_4_ * fVar187;
    fVar276 = local_3a0._8_4_ * auVar127._8_4_ + auVar365._8_4_ * fVar244;
    fVar190 = local_3a0._12_4_ * auVar127._12_4_ + auVar365._12_4_ * fVar188;
    fVar191 = local_3a0._16_4_ * auVar127._16_4_ + auVar365._16_4_ * fVar246;
    fVar192 = local_3a0._20_4_ * auVar127._20_4_ + auVar365._20_4_ * fVar189;
    fVar193 = local_3a0._24_4_ * auVar127._24_4_ + auVar365._24_4_ * fVar251;
    fVar195 = (float)local_200._0_4_ * auVar127._0_4_ + auVar322._0_4_ * fVar242;
    fVar215 = (float)local_200._4_4_ * auVar127._4_4_ + auVar322._4_4_ * fVar187;
    fVar216 = fStack_1f8 * auVar127._8_4_ + auVar322._8_4_ * fVar244;
    fVar217 = fStack_1f4 * auVar127._12_4_ + auVar322._12_4_ * fVar188;
    fVar218 = fStack_1f0 * auVar127._16_4_ + auVar322._16_4_ * fVar246;
    fVar219 = fStack_1ec * auVar127._20_4_ + auVar322._20_4_ * fVar189;
    fVar220 = fStack_1e8 * auVar127._24_4_ + auVar322._24_4_ * fVar251;
    fVar222 = (float)local_220._0_4_ * auVar127._0_4_ + auVar267._0_4_ * fVar242;
    fVar243 = (float)local_220._4_4_ * auVar127._4_4_ + auVar267._4_4_ * fVar187;
    fVar245 = fStack_218 * auVar127._8_4_ + auVar267._8_4_ * fVar244;
    fVar247 = fStack_214 * auVar127._12_4_ + auVar267._12_4_ * fVar188;
    fVar248 = fStack_210 * auVar127._16_4_ + auVar267._16_4_ * fVar246;
    fVar249 = fStack_20c * auVar127._20_4_ + auVar267._20_4_ * fVar189;
    fVar250 = fStack_208 * auVar127._24_4_ + auVar267._24_4_ * fVar251;
    fVar361 = fVar167 + auVar261._28_4_;
    fVar341 = auVar8._12_4_ + fVar167;
    auVar299._0_4_ =
         fVar242 * (auVar261._0_4_ * auVar127._0_4_ + fVar242 * (float)local_1e0._0_4_) +
         auVar127._0_4_ * fVar252;
    auVar299._4_4_ =
         fVar187 * (auVar261._4_4_ * auVar127._4_4_ + fVar187 * (float)local_1e0._4_4_) +
         auVar127._4_4_ * fVar269;
    auVar299._8_4_ =
         fVar244 * (auVar261._8_4_ * auVar127._8_4_ + fVar244 * fStack_1d8) +
         auVar127._8_4_ * fVar273;
    auVar299._12_4_ =
         fVar188 * (auVar261._12_4_ * auVar127._12_4_ + fVar188 * fStack_1d4) +
         auVar127._12_4_ * fVar277;
    auVar299._16_4_ =
         fVar246 * (auVar261._16_4_ * auVar127._16_4_ + fVar246 * fStack_1d0) +
         auVar127._16_4_ * fVar280;
    auVar299._20_4_ =
         fVar189 * (auVar261._20_4_ * auVar127._20_4_ + fVar189 * fStack_1cc) +
         auVar127._20_4_ * fVar283;
    auVar299._24_4_ =
         fVar251 * (auVar261._24_4_ * auVar127._24_4_ + fVar251 * fStack_1c8) +
         auVar127._24_4_ * fVar286;
    auVar299._28_4_ = local_380._28_4_ + fVar167;
    auVar308._0_4_ =
         fVar242 * (auVar365._0_4_ * auVar127._0_4_ + auVar310._0_4_ * fVar242) +
         auVar127._0_4_ * fVar268;
    auVar308._4_4_ =
         fVar187 * (auVar365._4_4_ * auVar127._4_4_ + auVar310._4_4_ * fVar187) +
         auVar127._4_4_ * fVar272;
    auVar308._8_4_ =
         fVar244 * (auVar365._8_4_ * auVar127._8_4_ + auVar310._8_4_ * fVar244) +
         auVar127._8_4_ * fVar276;
    auVar308._12_4_ =
         fVar188 * (auVar365._12_4_ * auVar127._12_4_ + auVar310._12_4_ * fVar188) +
         auVar127._12_4_ * fVar190;
    auVar308._16_4_ =
         fVar246 * (auVar365._16_4_ * auVar127._16_4_ + auVar310._16_4_ * fVar246) +
         auVar127._16_4_ * fVar191;
    auVar308._20_4_ =
         fVar189 * (auVar365._20_4_ * auVar127._20_4_ + auVar310._20_4_ * fVar189) +
         auVar127._20_4_ * fVar192;
    auVar308._24_4_ =
         fVar251 * (auVar365._24_4_ * auVar127._24_4_ + auVar310._24_4_ * fVar251) +
         auVar127._24_4_ * fVar193;
    auVar308._28_4_ = local_3a0._28_4_ + fVar167;
    auVar318._0_4_ =
         fVar242 * (auVar322._0_4_ * auVar127._0_4_ + local_360._0_4_ * fVar242) +
         auVar127._0_4_ * fVar195;
    auVar318._4_4_ =
         fVar187 * (auVar322._4_4_ * auVar127._4_4_ + local_360._4_4_ * fVar187) +
         auVar127._4_4_ * fVar215;
    auVar318._8_4_ =
         fVar244 * (auVar322._8_4_ * auVar127._8_4_ + local_360._8_4_ * fVar244) +
         auVar127._8_4_ * fVar216;
    auVar318._12_4_ =
         fVar188 * (auVar322._12_4_ * auVar127._12_4_ + local_360._12_4_ * fVar188) +
         auVar127._12_4_ * fVar217;
    auVar318._16_4_ =
         fVar246 * (auVar322._16_4_ * auVar127._16_4_ + local_360._16_4_ * fVar246) +
         auVar127._16_4_ * fVar218;
    auVar318._20_4_ =
         fVar189 * (auVar322._20_4_ * auVar127._20_4_ + local_360._20_4_ * fVar189) +
         auVar127._20_4_ * fVar219;
    auVar318._24_4_ =
         fVar251 * (auVar322._24_4_ * auVar127._24_4_ + local_360._24_4_ * fVar251) +
         auVar127._24_4_ * fVar220;
    auVar318._28_4_ = fStack_1e4 + fVar167;
    auVar294._0_4_ =
         auVar127._0_4_ * fVar222 +
         fVar242 * (auVar267._0_4_ * auVar127._0_4_ + auVar8._0_4_ * fVar242);
    auVar294._4_4_ =
         auVar127._4_4_ * fVar243 +
         fVar187 * (auVar267._4_4_ * auVar127._4_4_ + auVar8._4_4_ * fVar187);
    auVar294._8_4_ =
         auVar127._8_4_ * fVar245 +
         fVar244 * (auVar267._8_4_ * auVar127._8_4_ + auVar8._8_4_ * fVar244);
    auVar294._12_4_ =
         auVar127._12_4_ * fVar247 +
         fVar188 * (auVar267._12_4_ * auVar127._12_4_ + auVar8._12_4_ * fVar188);
    auVar294._16_4_ =
         auVar127._16_4_ * fVar248 +
         fVar246 * (auVar267._16_4_ * auVar127._16_4_ + auVar8._0_4_ * fVar246);
    auVar294._20_4_ =
         auVar127._20_4_ * fVar249 +
         fVar189 * (auVar267._20_4_ * auVar127._20_4_ + auVar8._4_4_ * fVar189);
    auVar294._24_4_ =
         auVar127._24_4_ * fVar250 +
         fVar251 * (auVar267._24_4_ * auVar127._24_4_ + auVar8._8_4_ * fVar251);
    auVar294._28_4_ = fStack_1e4 + fStack_204;
    auVar88._0_4_ =
         (auVar127._0_4_ * (float)local_240._0_4_ + local_380._0_4_ * fVar242) * auVar127._0_4_ +
         fVar242 * fVar252;
    auVar88._4_4_ =
         (auVar127._4_4_ * (float)local_240._4_4_ + local_380._4_4_ * fVar187) * auVar127._4_4_ +
         fVar187 * fVar269;
    auVar88._8_4_ =
         (auVar127._8_4_ * fStack_238 + local_380._8_4_ * fVar244) * auVar127._8_4_ +
         fVar244 * fVar273;
    auVar88._12_4_ =
         (auVar127._12_4_ * fStack_234 + local_380._12_4_ * fVar188) * auVar127._12_4_ +
         fVar188 * fVar277;
    auVar88._16_4_ =
         (auVar127._16_4_ * fStack_230 + local_380._16_4_ * fVar246) * auVar127._16_4_ +
         fVar246 * fVar280;
    auVar88._20_4_ =
         (auVar127._20_4_ * fStack_22c + local_380._20_4_ * fVar189) * auVar127._20_4_ +
         fVar189 * fVar283;
    auVar88._24_4_ =
         (auVar127._24_4_ * fStack_228 + local_380._24_4_ * fVar251) * auVar127._24_4_ +
         fVar251 * fVar286;
    auVar88._28_4_ = fStack_1e4 + fVar194 + auVar267._28_4_;
    auVar183._0_4_ =
         (auVar127._0_4_ * (float)local_260._0_4_ + local_3a0._0_4_ * fVar242) * auVar127._0_4_ +
         fVar242 * fVar268;
    auVar183._4_4_ =
         (auVar127._4_4_ * (float)local_260._4_4_ + local_3a0._4_4_ * fVar187) * auVar127._4_4_ +
         fVar187 * fVar272;
    auVar183._8_4_ =
         (auVar127._8_4_ * fStack_258 + local_3a0._8_4_ * fVar244) * auVar127._8_4_ +
         fVar244 * fVar276;
    auVar183._12_4_ =
         (auVar127._12_4_ * fStack_254 + local_3a0._12_4_ * fVar188) * auVar127._12_4_ +
         fVar188 * fVar190;
    auVar183._16_4_ =
         (auVar127._16_4_ * fStack_250 + local_3a0._16_4_ * fVar246) * auVar127._16_4_ +
         fVar246 * fVar191;
    auVar183._20_4_ =
         (auVar127._20_4_ * fStack_24c + local_3a0._20_4_ * fVar189) * auVar127._20_4_ +
         fVar189 * fVar192;
    auVar183._24_4_ =
         (auVar127._24_4_ * fStack_248 + local_3a0._24_4_ * fVar251) * auVar127._24_4_ +
         fVar251 * fVar193;
    auVar183._28_4_ = fStack_1e4 + fVar194 + 1.0;
    auVar207._0_4_ =
         (auVar127._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar242) *
         auVar127._0_4_ + fVar242 * fVar195;
    auVar207._4_4_ =
         (auVar127._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar187) *
         auVar127._4_4_ + fVar187 * fVar215;
    auVar207._8_4_ =
         (auVar127._8_4_ * fStack_278 + fStack_1f8 * fVar244) * auVar127._8_4_ + fVar244 * fVar216;
    auVar207._12_4_ =
         (auVar127._12_4_ * fStack_274 + fStack_1f4 * fVar188) * auVar127._12_4_ + fVar188 * fVar217
    ;
    auVar207._16_4_ =
         (auVar127._16_4_ * fStack_270 + fStack_1f0 * fVar246) * auVar127._16_4_ + fVar246 * fVar218
    ;
    auVar207._20_4_ =
         (auVar127._20_4_ * fStack_26c + fStack_1ec * fVar189) * auVar127._20_4_ + fVar189 * fVar219
    ;
    auVar207._24_4_ =
         (auVar127._24_4_ * fStack_268 + fStack_1e8 * fVar251) * auVar127._24_4_ + fVar251 * fVar220
    ;
    auVar207._28_4_ = fVar341 + 2.0;
    auVar233._0_4_ =
         (auVar127._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar242) *
         auVar127._0_4_ + fVar242 * fVar222;
    auVar233._4_4_ =
         (auVar127._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar187) *
         auVar127._4_4_ + fVar187 * fVar243;
    auVar233._8_4_ =
         (auVar127._8_4_ * fStack_298 + fStack_218 * fVar244) * auVar127._8_4_ + fVar244 * fVar245;
    auVar233._12_4_ =
         (auVar127._12_4_ * fStack_294 + fStack_214 * fVar188) * auVar127._12_4_ + fVar188 * fVar247
    ;
    auVar233._16_4_ =
         (auVar127._16_4_ * fStack_290 + fStack_210 * fVar246) * auVar127._16_4_ + fVar246 * fVar248
    ;
    auVar233._20_4_ =
         (auVar127._20_4_ * fStack_28c + fStack_20c * fVar189) * auVar127._20_4_ + fVar189 * fVar249
    ;
    auVar233._24_4_ =
         (auVar127._24_4_ * fStack_288 + fStack_208 * fVar251) * auVar127._24_4_ + fVar251 * fVar250
    ;
    auVar233._28_4_ = fVar361 + fVar167 + 1.0;
    fVar253 = auVar299._0_4_ * fVar242 + auVar127._0_4_ * auVar88._0_4_;
    fVar270 = auVar299._4_4_ * fVar187 + auVar127._4_4_ * auVar88._4_4_;
    fVar274 = auVar299._8_4_ * fVar244 + auVar127._8_4_ * auVar88._8_4_;
    fVar278 = auVar299._12_4_ * fVar188 + auVar127._12_4_ * auVar88._12_4_;
    fVar281 = auVar299._16_4_ * fVar246 + auVar127._16_4_ * auVar88._16_4_;
    fVar284 = auVar299._20_4_ * fVar189 + auVar127._20_4_ * auVar88._20_4_;
    fVar287 = auVar299._24_4_ * fVar251 + auVar127._24_4_ * auVar88._24_4_;
    fVar289 = fVar361 + fStack_1e4;
    auVar363._0_4_ = auVar308._0_4_ * fVar242 + auVar127._0_4_ * auVar183._0_4_;
    auVar363._4_4_ = auVar308._4_4_ * fVar187 + auVar127._4_4_ * auVar183._4_4_;
    auVar363._8_4_ = auVar308._8_4_ * fVar244 + auVar127._8_4_ * auVar183._8_4_;
    auVar363._12_4_ = auVar308._12_4_ * fVar188 + auVar127._12_4_ * auVar183._12_4_;
    auVar363._16_4_ = auVar308._16_4_ * fVar246 + auVar127._16_4_ * auVar183._16_4_;
    auVar363._20_4_ = auVar308._20_4_ * fVar189 + auVar127._20_4_ * auVar183._20_4_;
    auVar363._24_4_ = auVar308._24_4_ * fVar251 + auVar127._24_4_ * auVar183._24_4_;
    auVar363._28_4_ = fStack_1e4 + fVar341;
    local_2e0._0_4_ = auVar318._0_4_ * fVar242 + auVar127._0_4_ * auVar207._0_4_;
    local_2e0._4_4_ = auVar318._4_4_ * fVar187 + auVar127._4_4_ * auVar207._4_4_;
    local_2e0._8_4_ = auVar318._8_4_ * fVar244 + auVar127._8_4_ * auVar207._8_4_;
    local_2e0._12_4_ = auVar318._12_4_ * fVar188 + auVar127._12_4_ * auVar207._12_4_;
    local_2e0._16_4_ = auVar318._16_4_ * fVar246 + auVar127._16_4_ * auVar207._16_4_;
    local_2e0._20_4_ = auVar318._20_4_ * fVar189 + auVar127._20_4_ * auVar207._20_4_;
    local_2e0._24_4_ = auVar318._24_4_ * fVar251 + auVar127._24_4_ * auVar207._24_4_;
    local_2e0._28_4_ = fVar341 + fStack_1e4;
    local_b40._0_4_ = auVar14._0_4_;
    auVar262._0_4_ = fVar242 * auVar294._0_4_ + auVar127._0_4_ * auVar233._0_4_;
    auVar262._4_4_ = fVar187 * auVar294._4_4_ + auVar127._4_4_ * auVar233._4_4_;
    auVar262._8_4_ = fVar244 * auVar294._8_4_ + auVar127._8_4_ * auVar233._8_4_;
    auVar262._12_4_ = fVar188 * auVar294._12_4_ + auVar127._12_4_ * auVar233._12_4_;
    auVar262._16_4_ = fVar246 * auVar294._16_4_ + auVar127._16_4_ * auVar233._16_4_;
    auVar262._20_4_ = fVar189 * auVar294._20_4_ + auVar127._20_4_ * auVar233._20_4_;
    auVar262._24_4_ = fVar251 * auVar294._24_4_ + auVar127._24_4_ * auVar233._24_4_;
    auVar262._28_4_ = auVar126._28_4_ + auVar127._28_4_;
    auVar126 = vsubps_avx(auVar88,auVar299);
    auVar208 = vsubps_avx(auVar183,auVar308);
    auVar261 = vsubps_avx(auVar207,auVar318);
    auVar87 = vsubps_avx(auVar233,auVar294);
    auVar174 = vshufps_avx(ZEXT416((uint)((float)local_b40._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_b40._0_4_ * 0.04761905)),0);
    fVar215 = auVar174._0_4_;
    fVar330 = fVar215 * auVar126._0_4_ * 3.0;
    fVar216 = auVar174._4_4_;
    fVar335 = fVar216 * auVar126._4_4_ * 3.0;
    auVar20._4_4_ = fVar335;
    auVar20._0_4_ = fVar330;
    fVar222 = auVar174._8_4_;
    fVar336 = fVar222 * auVar126._8_4_ * 3.0;
    auVar20._8_4_ = fVar336;
    fVar191 = auVar174._12_4_;
    fVar337 = fVar191 * auVar126._12_4_ * 3.0;
    auVar20._12_4_ = fVar337;
    fVar338 = fVar215 * auVar126._16_4_ * 3.0;
    auVar20._16_4_ = fVar338;
    fVar339 = fVar216 * auVar126._20_4_ * 3.0;
    auVar20._20_4_ = fVar339;
    fVar340 = fVar222 * auVar126._24_4_ * 3.0;
    auVar20._24_4_ = fVar340;
    auVar20._28_4_ = fVar341;
    fVar317 = fVar215 * auVar208._0_4_ * 3.0;
    fVar324 = fVar216 * auVar208._4_4_ * 3.0;
    local_9c0._4_4_ = fVar324;
    local_9c0._0_4_ = fVar317;
    fVar325 = fVar222 * auVar208._8_4_ * 3.0;
    local_9c0._8_4_ = fVar325;
    fVar326 = fVar191 * auVar208._12_4_ * 3.0;
    local_9c0._12_4_ = fVar326;
    fVar327 = fVar215 * auVar208._16_4_ * 3.0;
    local_9c0._16_4_ = fVar327;
    fVar328 = fVar216 * auVar208._20_4_ * 3.0;
    local_9c0._20_4_ = fVar328;
    fVar329 = fVar222 * auVar208._24_4_ * 3.0;
    local_9c0._24_4_ = fVar329;
    local_9c0._28_4_ = auVar318._28_4_;
    fVar342 = fVar215 * auVar261._0_4_ * 3.0;
    fVar349 = fVar216 * auVar261._4_4_ * 3.0;
    auVar209._4_4_ = fVar349;
    auVar209._0_4_ = fVar342;
    fVar351 = fVar222 * auVar261._8_4_ * 3.0;
    auVar209._8_4_ = fVar351;
    fVar353 = fVar191 * auVar261._12_4_ * 3.0;
    auVar209._12_4_ = fVar353;
    fVar355 = fVar215 * auVar261._16_4_ * 3.0;
    auVar209._16_4_ = fVar355;
    fVar357 = fVar216 * auVar261._20_4_ * 3.0;
    auVar209._20_4_ = fVar357;
    fVar359 = fVar222 * auVar261._24_4_ * 3.0;
    auVar209._24_4_ = fVar359;
    auVar209._28_4_ = fVar361;
    fVar246 = fVar215 * auVar87._0_4_ * 3.0;
    fVar189 = fVar216 * auVar87._4_4_ * 3.0;
    auVar15._4_4_ = fVar189;
    auVar15._0_4_ = fVar246;
    fVar190 = fVar222 * auVar87._8_4_ * 3.0;
    auVar15._8_4_ = fVar190;
    fVar191 = fVar191 * auVar87._12_4_ * 3.0;
    auVar15._12_4_ = fVar191;
    fVar215 = fVar215 * auVar87._16_4_ * 3.0;
    auVar15._16_4_ = fVar215;
    fVar216 = fVar216 * auVar87._20_4_ * 3.0;
    auVar15._20_4_ = fVar216;
    fVar222 = fVar222 * auVar87._24_4_ * 3.0;
    auVar15._24_4_ = fVar222;
    auVar15._28_4_ = auVar208._28_4_;
    auVar126 = vperm2f128_avx(auVar363,auVar363,1);
    auVar126 = vshufps_avx(auVar126,auVar363,0x30);
    auVar322 = vshufps_avx(auVar363,auVar126,0x29);
    auVar126 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar126 = vshufps_avx(auVar126,local_2e0,0x30);
    auVar88 = vshufps_avx(local_2e0,auVar126,0x29);
    auVar261 = vsubps_avx(auVar262,auVar15);
    auVar126 = vperm2f128_avx(auVar261,auVar261,1);
    auVar126 = vshufps_avx(auVar126,auVar261,0x30);
    auVar15 = vshufps_avx(auVar261,auVar126,0x29);
    local_520 = vsubps_avx(auVar322,auVar363);
    local_300 = vsubps_avx(auVar88,local_2e0);
    fVar242 = local_520._0_4_;
    fVar251 = local_520._4_4_;
    auVar16._4_4_ = fVar349 * fVar251;
    auVar16._0_4_ = fVar342 * fVar242;
    fVar192 = local_520._8_4_;
    auVar16._8_4_ = fVar351 * fVar192;
    fVar217 = local_520._12_4_;
    auVar16._12_4_ = fVar353 * fVar217;
    fVar245 = local_520._16_4_;
    auVar16._16_4_ = fVar355 * fVar245;
    fVar269 = local_520._20_4_;
    auVar16._20_4_ = fVar357 * fVar269;
    fVar9 = local_520._24_4_;
    auVar16._24_4_ = fVar359 * fVar9;
    auVar16._28_4_ = auVar261._28_4_;
    fVar187 = local_300._0_4_;
    fVar268 = local_300._4_4_;
    auVar17._4_4_ = fVar324 * fVar268;
    auVar17._0_4_ = fVar317 * fVar187;
    fVar193 = local_300._8_4_;
    auVar17._8_4_ = fVar325 * fVar193;
    fVar218 = local_300._12_4_;
    auVar17._12_4_ = fVar326 * fVar218;
    fVar247 = local_300._16_4_;
    auVar17._16_4_ = fVar327 * fVar247;
    fVar273 = local_300._20_4_;
    auVar17._20_4_ = fVar328 * fVar273;
    fVar10 = local_300._24_4_;
    auVar17._24_4_ = fVar329 * fVar10;
    auVar17._28_4_ = auVar126._28_4_;
    auVar17 = vsubps_avx(auVar17,auVar16);
    auVar61._4_4_ = fVar270;
    auVar61._0_4_ = fVar253;
    auVar61._8_4_ = fVar274;
    auVar61._12_4_ = fVar278;
    auVar61._16_4_ = fVar281;
    auVar61._20_4_ = fVar284;
    auVar61._24_4_ = fVar287;
    auVar61._28_4_ = fVar289;
    auVar126 = vperm2f128_avx(auVar61,auVar61,1);
    auVar126 = vshufps_avx(auVar126,auVar61,0x30);
    auVar16 = vshufps_avx(auVar61,auVar126,0x29);
    local_540 = vsubps_avx(auVar16,auVar61);
    auVar18._4_4_ = fVar335 * fVar268;
    auVar18._0_4_ = fVar330 * fVar187;
    auVar18._8_4_ = fVar336 * fVar193;
    auVar18._12_4_ = fVar337 * fVar218;
    auVar18._16_4_ = fVar338 * fVar247;
    auVar18._20_4_ = fVar339 * fVar273;
    auVar18._24_4_ = fVar340 * fVar10;
    auVar18._28_4_ = auVar16._28_4_;
    fVar244 = local_540._0_4_;
    fVar272 = local_540._4_4_;
    auVar19._4_4_ = fVar349 * fVar272;
    auVar19._0_4_ = fVar342 * fVar244;
    fVar194 = local_540._8_4_;
    auVar19._8_4_ = fVar351 * fVar194;
    fVar219 = local_540._12_4_;
    auVar19._12_4_ = fVar353 * fVar219;
    fVar248 = local_540._16_4_;
    auVar19._16_4_ = fVar355 * fVar248;
    fVar277 = local_540._20_4_;
    auVar19._20_4_ = fVar357 * fVar277;
    fVar11 = local_540._24_4_;
    auVar19._24_4_ = fVar359 * fVar11;
    auVar19._28_4_ = auVar299._28_4_;
    auVar18 = vsubps_avx(auVar19,auVar18);
    auVar348._4_4_ = fVar324 * fVar272;
    auVar348._0_4_ = fVar317 * fVar244;
    auVar348._8_4_ = fVar325 * fVar194;
    auVar348._12_4_ = fVar326 * fVar219;
    auVar348._16_4_ = fVar327 * fVar248;
    auVar348._20_4_ = fVar328 * fVar277;
    auVar348._24_4_ = fVar329 * fVar11;
    auVar348._28_4_ = auVar299._28_4_;
    auVar21._4_4_ = fVar335 * fVar251;
    auVar21._0_4_ = fVar330 * fVar242;
    auVar21._8_4_ = fVar336 * fVar192;
    auVar21._12_4_ = fVar337 * fVar217;
    auVar21._16_4_ = fVar338 * fVar245;
    auVar21._20_4_ = fVar339 * fVar269;
    auVar21._24_4_ = fVar340 * fVar9;
    auVar21._28_4_ = auVar308._28_4_;
    auVar19 = vsubps_avx(auVar21,auVar348);
    fVar167 = auVar19._28_4_;
    auVar184._0_4_ = fVar244 * fVar244 + fVar242 * fVar242 + fVar187 * fVar187;
    auVar184._4_4_ = fVar272 * fVar272 + fVar251 * fVar251 + fVar268 * fVar268;
    auVar184._8_4_ = fVar194 * fVar194 + fVar192 * fVar192 + fVar193 * fVar193;
    auVar184._12_4_ = fVar219 * fVar219 + fVar217 * fVar217 + fVar218 * fVar218;
    auVar184._16_4_ = fVar248 * fVar248 + fVar245 * fVar245 + fVar247 * fVar247;
    auVar184._20_4_ = fVar277 * fVar277 + fVar269 * fVar269 + fVar273 * fVar273;
    auVar184._24_4_ = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
    auVar184._28_4_ = fVar167 + fVar167 + auVar17._28_4_;
    auVar126 = vrcpps_avx(auVar184);
    fVar243 = auVar126._0_4_;
    fVar250 = auVar126._4_4_;
    auVar22._4_4_ = fVar250 * auVar184._4_4_;
    auVar22._0_4_ = fVar243 * auVar184._0_4_;
    fVar252 = auVar126._8_4_;
    auVar22._8_4_ = fVar252 * auVar184._8_4_;
    fVar283 = auVar126._12_4_;
    auVar22._12_4_ = fVar283 * auVar184._12_4_;
    fVar286 = auVar126._16_4_;
    auVar22._16_4_ = fVar286 * auVar184._16_4_;
    fVar302 = auVar126._20_4_;
    auVar22._20_4_ = fVar302 * auVar184._20_4_;
    fVar303 = auVar126._24_4_;
    auVar22._24_4_ = fVar303 * auVar184._24_4_;
    auVar22._28_4_ = auVar308._28_4_;
    auVar89._8_4_ = 0x3f800000;
    auVar89._0_8_ = 0x3f8000003f800000;
    auVar89._12_4_ = 0x3f800000;
    auVar89._16_4_ = 0x3f800000;
    auVar89._20_4_ = 0x3f800000;
    auVar89._24_4_ = 0x3f800000;
    auVar89._28_4_ = 0x3f800000;
    auVar348 = vsubps_avx(auVar89,auVar22);
    fVar243 = fVar243 + fVar243 * auVar348._0_4_;
    fVar250 = fVar250 + fVar250 * auVar348._4_4_;
    fVar252 = fVar252 + fVar252 * auVar348._8_4_;
    fVar283 = fVar283 + fVar283 * auVar348._12_4_;
    fVar286 = fVar286 + fVar286 * auVar348._16_4_;
    fVar302 = fVar302 + fVar302 * auVar348._20_4_;
    fVar303 = fVar303 + fVar303 * auVar348._24_4_;
    auVar261 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar261 = vshufps_avx(auVar261,local_9c0,0x30);
    auVar261 = vshufps_avx(local_9c0,auVar261,0x29);
    auVar87 = vperm2f128_avx(auVar209,auVar209,1);
    auVar87 = vshufps_avx(auVar87,auVar209,0x30);
    local_960 = vshufps_avx(auVar209,auVar87,0x29);
    fVar75 = local_960._0_4_;
    fVar103 = local_960._4_4_;
    auVar23._4_4_ = fVar103 * fVar251;
    auVar23._0_4_ = fVar75 * fVar242;
    fVar105 = local_960._8_4_;
    auVar23._8_4_ = fVar105 * fVar192;
    fVar107 = local_960._12_4_;
    auVar23._12_4_ = fVar107 * fVar217;
    fVar108 = local_960._16_4_;
    auVar23._16_4_ = fVar108 * fVar245;
    fVar109 = local_960._20_4_;
    auVar23._20_4_ = fVar109 * fVar269;
    fVar110 = local_960._24_4_;
    auVar23._24_4_ = fVar110 * fVar9;
    auVar23._28_4_ = auVar87._28_4_;
    fVar188 = auVar261._0_4_;
    fVar276 = auVar261._4_4_;
    auVar24._4_4_ = fVar268 * fVar276;
    auVar24._0_4_ = fVar187 * fVar188;
    fVar195 = auVar261._8_4_;
    auVar24._8_4_ = fVar193 * fVar195;
    fVar220 = auVar261._12_4_;
    auVar24._12_4_ = fVar218 * fVar220;
    fVar249 = auVar261._16_4_;
    auVar24._16_4_ = fVar247 * fVar249;
    fVar280 = auVar261._20_4_;
    auVar24._20_4_ = fVar273 * fVar280;
    fVar12 = auVar261._24_4_;
    auVar24._24_4_ = fVar10 * fVar12;
    auVar24._28_4_ = auVar318._28_4_;
    auVar87 = vsubps_avx(auVar24,auVar23);
    auVar261 = vperm2f128_avx(auVar20,auVar20,1);
    auVar261 = vshufps_avx(auVar261,auVar20,0x30);
    local_b00 = vshufps_avx(auVar20,auVar261,0x29);
    fVar343 = local_b00._0_4_;
    fVar350 = local_b00._4_4_;
    auVar25._4_4_ = fVar350 * fVar268;
    auVar25._0_4_ = fVar343 * fVar187;
    fVar352 = local_b00._8_4_;
    auVar25._8_4_ = fVar352 * fVar193;
    fVar354 = local_b00._12_4_;
    auVar25._12_4_ = fVar354 * fVar218;
    fVar356 = local_b00._16_4_;
    auVar25._16_4_ = fVar356 * fVar247;
    fVar358 = local_b00._20_4_;
    auVar25._20_4_ = fVar358 * fVar273;
    fVar360 = local_b00._24_4_;
    auVar25._24_4_ = fVar360 * fVar10;
    auVar25._28_4_ = auVar261._28_4_;
    auVar26._4_4_ = fVar272 * fVar103;
    auVar26._0_4_ = fVar244 * fVar75;
    auVar26._8_4_ = fVar194 * fVar105;
    auVar26._12_4_ = fVar219 * fVar107;
    auVar26._16_4_ = fVar248 * fVar108;
    auVar26._20_4_ = fVar277 * fVar109;
    auVar26._24_4_ = fVar11 * fVar110;
    auVar26._28_4_ = fVar341;
    auVar261 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar272 * fVar276;
    auVar27._0_4_ = fVar244 * fVar188;
    auVar27._8_4_ = fVar194 * fVar195;
    auVar27._12_4_ = fVar219 * fVar220;
    auVar27._16_4_ = fVar248 * fVar249;
    auVar27._20_4_ = fVar277 * fVar280;
    auVar27._24_4_ = fVar11 * fVar12;
    auVar27._28_4_ = fVar341;
    auVar28._4_4_ = fVar350 * fVar251;
    auVar28._0_4_ = fVar343 * fVar242;
    auVar28._8_4_ = fVar352 * fVar192;
    auVar28._12_4_ = fVar354 * fVar217;
    auVar28._16_4_ = fVar356 * fVar245;
    auVar28._20_4_ = fVar358 * fVar269;
    fVar341 = local_b00._28_4_;
    auVar28._24_4_ = fVar360 * fVar9;
    auVar28._28_4_ = fVar341;
    auVar20 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ =
         fVar250 * (auVar17._4_4_ * auVar17._4_4_ +
                   auVar19._4_4_ * auVar19._4_4_ + auVar18._4_4_ * auVar18._4_4_);
    auVar29._0_4_ =
         fVar243 * (auVar17._0_4_ * auVar17._0_4_ +
                   auVar19._0_4_ * auVar19._0_4_ + auVar18._0_4_ * auVar18._0_4_);
    auVar29._8_4_ =
         fVar252 * (auVar17._8_4_ * auVar17._8_4_ +
                   auVar19._8_4_ * auVar19._8_4_ + auVar18._8_4_ * auVar18._8_4_);
    auVar29._12_4_ =
         fVar283 * (auVar17._12_4_ * auVar17._12_4_ +
                   auVar19._12_4_ * auVar19._12_4_ + auVar18._12_4_ * auVar18._12_4_);
    auVar29._16_4_ =
         fVar286 * (auVar17._16_4_ * auVar17._16_4_ +
                   auVar19._16_4_ * auVar19._16_4_ + auVar18._16_4_ * auVar18._16_4_);
    auVar29._20_4_ =
         fVar302 * (auVar17._20_4_ * auVar17._20_4_ +
                   auVar19._20_4_ * auVar19._20_4_ + auVar18._20_4_ * auVar18._20_4_);
    auVar29._24_4_ =
         fVar303 * (auVar17._24_4_ * auVar17._24_4_ +
                   auVar19._24_4_ * auVar19._24_4_ + auVar18._24_4_ * auVar18._24_4_);
    auVar29._28_4_ = auVar17._28_4_ + fVar167 + auVar18._28_4_;
    auVar30._4_4_ =
         (auVar87._4_4_ * auVar87._4_4_ +
         auVar261._4_4_ * auVar261._4_4_ + auVar20._4_4_ * auVar20._4_4_) * fVar250;
    auVar30._0_4_ =
         (auVar87._0_4_ * auVar87._0_4_ +
         auVar261._0_4_ * auVar261._0_4_ + auVar20._0_4_ * auVar20._0_4_) * fVar243;
    auVar30._8_4_ =
         (auVar87._8_4_ * auVar87._8_4_ +
         auVar261._8_4_ * auVar261._8_4_ + auVar20._8_4_ * auVar20._8_4_) * fVar252;
    auVar30._12_4_ =
         (auVar87._12_4_ * auVar87._12_4_ +
         auVar261._12_4_ * auVar261._12_4_ + auVar20._12_4_ * auVar20._12_4_) * fVar283;
    auVar30._16_4_ =
         (auVar87._16_4_ * auVar87._16_4_ +
         auVar261._16_4_ * auVar261._16_4_ + auVar20._16_4_ * auVar20._16_4_) * fVar286;
    auVar30._20_4_ =
         (auVar87._20_4_ * auVar87._20_4_ +
         auVar261._20_4_ * auVar261._20_4_ + auVar20._20_4_ * auVar20._20_4_) * fVar302;
    auVar30._24_4_ =
         (auVar87._24_4_ * auVar87._24_4_ +
         auVar261._24_4_ * auVar261._24_4_ + auVar20._24_4_ * auVar20._24_4_) * fVar303;
    auVar30._28_4_ = auVar126._28_4_ + auVar348._28_4_;
    auVar126 = vmaxps_avx(auVar29,auVar30);
    auVar261 = vperm2f128_avx(auVar262,auVar262,1);
    auVar261 = vshufps_avx(auVar261,auVar262,0x30);
    auVar17 = vshufps_avx(auVar262,auVar261,0x29);
    auVar147._0_4_ = auVar262._0_4_ + fVar246;
    auVar147._4_4_ = auVar262._4_4_ + fVar189;
    auVar147._8_4_ = auVar262._8_4_ + fVar190;
    auVar147._12_4_ = auVar262._12_4_ + fVar191;
    auVar147._16_4_ = auVar262._16_4_ + fVar215;
    auVar147._20_4_ = auVar262._20_4_ + fVar216;
    auVar147._24_4_ = auVar262._24_4_ + fVar222;
    auVar147._28_4_ = auVar262._28_4_ + auVar208._28_4_;
    auVar261 = vmaxps_avx(auVar262,auVar147);
    auVar87 = vmaxps_avx(auVar15,auVar17);
    auVar261 = vmaxps_avx(auVar261,auVar87);
    auVar87 = vrsqrtps_avx(auVar184);
    fVar167 = auVar87._0_4_;
    fVar246 = auVar87._4_4_;
    fVar189 = auVar87._8_4_;
    fVar190 = auVar87._12_4_;
    fVar191 = auVar87._16_4_;
    fVar215 = auVar87._20_4_;
    fVar216 = auVar87._24_4_;
    local_600 = fVar167 * 1.5 + fVar167 * fVar167 * fVar167 * auVar184._0_4_ * -0.5;
    fStack_5fc = fVar246 * 1.5 + fVar246 * fVar246 * fVar246 * auVar184._4_4_ * -0.5;
    fStack_5f8 = fVar189 * 1.5 + fVar189 * fVar189 * fVar189 * auVar184._8_4_ * -0.5;
    fStack_5f4 = fVar190 * 1.5 + fVar190 * fVar190 * fVar190 * auVar184._12_4_ * -0.5;
    fStack_5f0 = fVar191 * 1.5 + fVar191 * fVar191 * fVar191 * auVar184._16_4_ * -0.5;
    fStack_5ec = fVar215 * 1.5 + fVar215 * fVar215 * fVar215 * auVar184._20_4_ * -0.5;
    fStack_5e8 = fVar216 * 1.5 + fVar216 * fVar216 * fVar216 * auVar184._24_4_ * -0.5;
    auVar208 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a80 = vsubps_avx(auVar208,auVar363);
    auVar208 = vsubps_avx(auVar208,local_2e0);
    fVar307 = auVar208._0_4_;
    fVar311 = auVar208._4_4_;
    fVar312 = auVar208._8_4_;
    fVar313 = auVar208._12_4_;
    fVar314 = auVar208._16_4_;
    fVar315 = auVar208._20_4_;
    fVar316 = auVar208._24_4_;
    fVar246 = local_a80._0_4_;
    fVar190 = local_a80._4_4_;
    fVar215 = local_a80._8_4_;
    fVar222 = local_a80._12_4_;
    fVar250 = local_a80._16_4_;
    fVar283 = local_a80._20_4_;
    fVar302 = local_a80._24_4_;
    auVar62._4_4_ = fVar270;
    auVar62._0_4_ = fVar253;
    auVar62._8_4_ = fVar274;
    auVar62._12_4_ = fVar278;
    auVar62._16_4_ = fVar281;
    auVar62._20_4_ = fVar284;
    auVar62._24_4_ = fVar287;
    auVar62._28_4_ = fVar289;
    auVar209 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar208 = vsubps_avx(auVar209,auVar62);
    fVar189 = auVar208._0_4_;
    fVar191 = auVar208._4_4_;
    fVar216 = auVar208._8_4_;
    fVar243 = auVar208._12_4_;
    fVar252 = auVar208._16_4_;
    fVar286 = auVar208._20_4_;
    fVar303 = auVar208._24_4_;
    auVar333._0_4_ =
         (float)local_aa0._0_4_ * fVar189 +
         (float)local_820._0_4_ * fVar246 + fVar307 * (float)local_8e0._0_4_;
    auVar333._4_4_ =
         (float)local_aa0._4_4_ * fVar191 +
         (float)local_820._4_4_ * fVar190 + fVar311 * (float)local_8e0._4_4_;
    auVar333._8_4_ = fStack_a98 * fVar216 + fStack_818 * fVar215 + fVar312 * fStack_8d8;
    auVar333._12_4_ = fStack_a94 * fVar243 + fStack_814 * fVar222 + fVar313 * fStack_8d4;
    auVar333._16_4_ = fStack_a90 * fVar252 + fStack_810 * fVar250 + fVar314 * fStack_8d0;
    auVar333._20_4_ = fStack_a8c * fVar286 + fStack_80c * fVar283 + fVar315 * fStack_8cc;
    auVar333._24_4_ = fStack_a88 * fVar303 + fStack_808 * fVar302 + fVar316 * fStack_8c8;
    auVar333._28_4_ = fVar341 + auVar20._28_4_ + auVar184._28_4_;
    auVar346._0_4_ = fVar189 * fVar189 + fVar246 * fVar246 + fVar307 * fVar307;
    auVar346._4_4_ = fVar191 * fVar191 + fVar190 * fVar190 + fVar311 * fVar311;
    auVar346._8_4_ = fVar216 * fVar216 + fVar215 * fVar215 + fVar312 * fVar312;
    auVar346._12_4_ = fVar243 * fVar243 + fVar222 * fVar222 + fVar313 * fVar313;
    auVar346._16_4_ = fVar252 * fVar252 + fVar250 * fVar250 + fVar314 * fVar314;
    auVar346._20_4_ = fVar286 * fVar286 + fVar283 * fVar283 + fVar315 * fVar315;
    auVar346._24_4_ = fVar303 * fVar303 + fVar302 * fVar302 + fVar316 * fVar316;
    auVar346._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar341;
    local_560 = (float)local_aa0._0_4_ * fVar244 * local_600 +
                local_600 * fVar242 * (float)local_820._0_4_ +
                fVar187 * local_600 * (float)local_8e0._0_4_;
    fStack_55c = (float)local_aa0._4_4_ * fVar272 * fStack_5fc +
                 fStack_5fc * fVar251 * (float)local_820._4_4_ +
                 fVar268 * fStack_5fc * (float)local_8e0._4_4_;
    fStack_558 = fStack_a98 * fVar194 * fStack_5f8 +
                 fStack_5f8 * fVar192 * fStack_818 + fVar193 * fStack_5f8 * fStack_8d8;
    fStack_554 = fStack_a94 * fVar219 * fStack_5f4 +
                 fStack_5f4 * fVar217 * fStack_814 + fVar218 * fStack_5f4 * fStack_8d4;
    fStack_550 = fStack_a90 * fVar248 * fStack_5f0 +
                 fStack_5f0 * fVar245 * fStack_810 + fVar247 * fStack_5f0 * fStack_8d0;
    fStack_54c = fStack_a8c * fVar277 * fStack_5ec +
                 fStack_5ec * fVar269 * fStack_80c + fVar273 * fStack_5ec * fStack_8cc;
    fStack_548 = fStack_a88 * fVar11 * fStack_5e8 +
                 fStack_5e8 * fVar9 * fStack_808 + fVar10 * fStack_5e8 * fStack_8c8;
    fVar167 = fStack_a84 + fStack_804 + fStack_8c4;
    local_620 = fVar189 * fVar244 * local_600 +
                local_600 * fVar242 * fVar246 + fVar307 * fVar187 * local_600;
    fStack_61c = fVar191 * fVar272 * fStack_5fc +
                 fStack_5fc * fVar251 * fVar190 + fVar311 * fVar268 * fStack_5fc;
    fStack_618 = fVar216 * fVar194 * fStack_5f8 +
                 fStack_5f8 * fVar192 * fVar215 + fVar312 * fVar193 * fStack_5f8;
    fStack_614 = fVar243 * fVar219 * fStack_5f4 +
                 fStack_5f4 * fVar217 * fVar222 + fVar313 * fVar218 * fStack_5f4;
    fStack_610 = fVar252 * fVar248 * fStack_5f0 +
                 fStack_5f0 * fVar245 * fVar250 + fVar314 * fVar247 * fStack_5f0;
    fStack_60c = fVar286 * fVar277 * fStack_5ec +
                 fStack_5ec * fVar269 * fVar283 + fVar315 * fVar273 * fStack_5ec;
    fStack_608 = fVar303 * fVar11 * fStack_5e8 +
                 fStack_5e8 * fVar9 * fVar302 + fVar316 * fVar10 * fStack_5e8;
    fStack_604 = fStack_804 + fVar167;
    auVar208._4_4_ = fStack_55c * fStack_61c;
    auVar208._0_4_ = local_560 * local_620;
    auVar208._8_4_ = fStack_558 * fStack_618;
    auVar208._12_4_ = fStack_554 * fStack_614;
    auVar208._16_4_ = fStack_550 * fStack_610;
    auVar208._20_4_ = fStack_54c * fStack_60c;
    auVar208._24_4_ = fStack_548 * fStack_608;
    auVar208._28_4_ = fVar167;
    auVar18 = vsubps_avx(auVar333,auVar208);
    auVar31._4_4_ = fStack_61c * fStack_61c;
    auVar31._0_4_ = local_620 * local_620;
    auVar31._8_4_ = fStack_618 * fStack_618;
    auVar31._12_4_ = fStack_614 * fStack_614;
    auVar31._16_4_ = fStack_610 * fStack_610;
    auVar31._20_4_ = fStack_60c * fStack_60c;
    auVar31._24_4_ = fStack_608 * fStack_608;
    auVar31._28_4_ = fStack_804;
    auVar19 = vsubps_avx(auVar346,auVar31);
    auVar208 = vsqrtps_avx(auVar126);
    fVar167 = (auVar208._0_4_ + auVar261._0_4_) * 1.0000002;
    fVar341 = (auVar208._4_4_ + auVar261._4_4_) * 1.0000002;
    fVar157 = (auVar208._8_4_ + auVar261._8_4_) * 1.0000002;
    fVar159 = (auVar208._12_4_ + auVar261._12_4_) * 1.0000002;
    fVar161 = (auVar208._16_4_ + auVar261._16_4_) * 1.0000002;
    fVar163 = (auVar208._20_4_ + auVar261._20_4_) * 1.0000002;
    fVar165 = (auVar208._24_4_ + auVar261._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar341 * fVar341;
    auVar32._0_4_ = fVar167 * fVar167;
    auVar32._8_4_ = fVar157 * fVar157;
    auVar32._12_4_ = fVar159 * fVar159;
    auVar32._16_4_ = fVar161 * fVar161;
    auVar32._20_4_ = fVar163 * fVar163;
    auVar32._24_4_ = fVar165 * fVar165;
    auVar32._28_4_ = auVar208._28_4_ + auVar261._28_4_;
    local_a20._0_4_ = auVar18._0_4_ + auVar18._0_4_;
    local_a20._4_4_ = auVar18._4_4_ + auVar18._4_4_;
    local_a20._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    local_a20._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    local_a20._16_4_ = auVar18._16_4_ + auVar18._16_4_;
    local_a20._20_4_ = auVar18._20_4_ + auVar18._20_4_;
    local_a20._24_4_ = auVar18._24_4_ + auVar18._24_4_;
    fVar167 = auVar18._28_4_;
    local_a20._28_4_ = fVar167 + fVar167;
    auVar261 = vsubps_avx(auVar19,auVar32);
    auVar33._4_4_ = fStack_55c * fStack_55c;
    auVar33._0_4_ = local_560 * local_560;
    auVar33._8_4_ = fStack_558 * fStack_558;
    auVar33._12_4_ = fStack_554 * fStack_554;
    auVar33._16_4_ = fStack_550 * fStack_550;
    auVar33._20_4_ = fStack_54c * fStack_54c;
    auVar33._24_4_ = fStack_548 * fStack_548;
    auVar33._28_4_ = fVar167;
    auVar18 = vsubps_avx(local_2c0,auVar33);
    auVar34._4_4_ = local_a20._4_4_ * local_a20._4_4_;
    auVar34._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar34._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    auVar34._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    auVar34._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    auVar34._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    auVar34._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    auVar34._28_4_ = local_2c0._28_4_;
    fVar167 = auVar18._0_4_;
    fVar341 = auVar18._4_4_;
    fVar157 = auVar18._8_4_;
    fVar159 = auVar18._12_4_;
    fVar161 = auVar18._16_4_;
    fVar163 = auVar18._20_4_;
    fVar165 = auVar18._24_4_;
    auVar35._4_4_ = auVar261._4_4_ * fVar341 * 4.0;
    auVar35._0_4_ = auVar261._0_4_ * fVar167 * 4.0;
    auVar35._8_4_ = auVar261._8_4_ * fVar157 * 4.0;
    auVar35._12_4_ = auVar261._12_4_ * fVar159 * 4.0;
    auVar35._16_4_ = auVar261._16_4_ * fVar161 * 4.0;
    auVar35._20_4_ = auVar261._20_4_ * fVar163 * 4.0;
    auVar35._24_4_ = auVar261._24_4_ * fVar165 * 4.0;
    auVar35._28_4_ = 0x40800000;
    auVar348 = vsubps_avx(auVar34,auVar35);
    auVar126 = vcmpps_avx(auVar348,auVar209,5);
    auVar310 = ZEXT3264(auVar126);
    auVar90._8_4_ = 0x7fffffff;
    auVar90._0_8_ = 0x7fffffff7fffffff;
    auVar90._12_4_ = 0x7fffffff;
    auVar90._16_4_ = 0x7fffffff;
    auVar90._20_4_ = 0x7fffffff;
    auVar90._24_4_ = 0x7fffffff;
    auVar90._28_4_ = 0x7fffffff;
    local_420 = vandps_avx(auVar33,auVar90);
    local_340._0_4_ = fVar167 + fVar167;
    local_340._4_4_ = fVar341 + fVar341;
    local_340._8_4_ = fVar157 + fVar157;
    local_340._12_4_ = fVar159 + fVar159;
    local_340._16_4_ = fVar161 + fVar161;
    local_340._20_4_ = fVar163 + fVar163;
    local_340._24_4_ = fVar165 + fVar165;
    local_340._28_4_ = auVar18._28_4_ + auVar18._28_4_;
    local_a00 = vandps_avx(auVar18,auVar90);
    uVar68 = CONCAT44(local_a20._4_4_,local_a20._0_4_);
    local_320._0_8_ = uVar68 ^ 0x8000000080000000;
    local_320._8_4_ = -local_a20._8_4_;
    local_320._12_4_ = -local_a20._12_4_;
    local_320._16_4_ = -local_a20._16_4_;
    local_320._20_4_ = -local_a20._20_4_;
    local_320._24_4_ = -local_a20._24_4_;
    local_320._28_4_ = -local_a20._28_4_;
    fStack_544 = fStack_a84 + fStack_804 + fStack_8c4;
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0x7f,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0xbf,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
    {
      local_980._8_4_ = 0x7f800000;
      local_980._0_8_ = 0x7f8000007f800000;
      local_980._12_4_ = 0x7f800000;
      local_980._16_4_ = 0x7f800000;
      local_980._20_4_ = 0x7f800000;
      local_980._24_4_ = 0x7f800000;
      local_980._28_4_ = 0x7f800000;
      auVar148._8_4_ = 0xff800000;
      auVar148._0_8_ = 0xff800000ff800000;
      auVar148._12_4_ = 0xff800000;
      auVar148._16_4_ = 0xff800000;
      auVar148._20_4_ = 0xff800000;
      auVar148._24_4_ = 0xff800000;
      auVar148._28_4_ = 0xff800000;
    }
    else {
      auVar20 = vsqrtps_avx(auVar348);
      auVar18 = vrcpps_avx(local_340);
      auVar126 = vcmpps_avx(auVar348,auVar209,5);
      fVar140 = auVar18._0_4_;
      fVar156 = auVar18._4_4_;
      auVar36._4_4_ = local_340._4_4_ * fVar156;
      auVar36._0_4_ = local_340._0_4_ * fVar140;
      fVar158 = auVar18._8_4_;
      auVar36._8_4_ = local_340._8_4_ * fVar158;
      fVar160 = auVar18._12_4_;
      auVar36._12_4_ = local_340._12_4_ * fVar160;
      fVar162 = auVar18._16_4_;
      auVar36._16_4_ = local_340._16_4_ * fVar162;
      fVar164 = auVar18._20_4_;
      auVar36._20_4_ = local_340._20_4_ * fVar164;
      fVar166 = auVar18._24_4_;
      auVar36._24_4_ = local_340._24_4_ * fVar166;
      auVar36._28_4_ = auVar348._28_4_;
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar91._16_4_ = 0x3f800000;
      auVar91._20_4_ = 0x3f800000;
      auVar91._24_4_ = 0x3f800000;
      auVar91._28_4_ = 0x3f800000;
      auVar348 = vsubps_avx(auVar91,auVar36);
      fVar140 = fVar140 + fVar140 * auVar348._0_4_;
      fVar156 = fVar156 + fVar156 * auVar348._4_4_;
      fVar158 = fVar158 + fVar158 * auVar348._8_4_;
      fVar160 = fVar160 + fVar160 * auVar348._12_4_;
      fVar162 = fVar162 + fVar162 * auVar348._16_4_;
      fVar164 = fVar164 + fVar164 * auVar348._20_4_;
      fVar166 = fVar166 + fVar166 * auVar348._24_4_;
      auVar209 = vsubps_avx(local_320,auVar20);
      fVar254 = auVar209._0_4_ * fVar140;
      fVar271 = auVar209._4_4_ * fVar156;
      auVar37._4_4_ = fVar271;
      auVar37._0_4_ = fVar254;
      fVar275 = auVar209._8_4_ * fVar158;
      auVar37._8_4_ = fVar275;
      fVar279 = auVar209._12_4_ * fVar160;
      auVar37._12_4_ = fVar279;
      fVar282 = auVar209._16_4_ * fVar162;
      auVar37._16_4_ = fVar282;
      fVar285 = auVar209._20_4_ * fVar164;
      auVar37._20_4_ = fVar285;
      fVar288 = auVar209._24_4_ * fVar166;
      auVar37._24_4_ = fVar288;
      auVar37._28_4_ = auVar209._28_4_;
      auVar20 = vsubps_avx(auVar20,local_a20);
      fVar140 = auVar20._0_4_ * fVar140;
      fVar156 = auVar20._4_4_ * fVar156;
      auVar38._4_4_ = fVar156;
      auVar38._0_4_ = fVar140;
      fVar158 = auVar20._8_4_ * fVar158;
      auVar38._8_4_ = fVar158;
      fVar160 = auVar20._12_4_ * fVar160;
      auVar38._12_4_ = fVar160;
      fVar162 = auVar20._16_4_ * fVar162;
      auVar38._16_4_ = fVar162;
      fVar164 = auVar20._20_4_ * fVar164;
      auVar38._20_4_ = fVar164;
      fVar166 = auVar20._24_4_ * fVar166;
      auVar38._24_4_ = fVar166;
      auVar38._28_4_ = auVar18._28_4_ + auVar348._28_4_;
      fStack_3e4 = fStack_604 + auVar20._28_4_;
      local_400 = local_600 * (local_620 + local_560 * fVar254);
      fStack_3fc = fStack_5fc * (fStack_61c + fStack_55c * fVar271);
      fStack_3f8 = fStack_5f8 * (fStack_618 + fStack_558 * fVar275);
      fStack_3f4 = fStack_5f4 * (fStack_614 + fStack_554 * fVar279);
      fStack_3f0 = fStack_5f0 * (fStack_610 + fStack_550 * fVar282);
      fStack_3ec = fStack_5ec * (fStack_60c + fStack_54c * fVar285);
      fStack_3e8 = fStack_5e8 * (fStack_608 + fStack_548 * fVar288);
      local_3e0 = local_600 * (local_620 + local_560 * fVar140);
      fStack_3dc = fStack_5fc * (fStack_61c + fStack_55c * fVar156);
      fStack_3d8 = fStack_5f8 * (fStack_618 + fStack_558 * fVar158);
      fStack_3d4 = fStack_5f4 * (fStack_614 + fStack_554 * fVar160);
      fStack_3d0 = fStack_5f0 * (fStack_610 + fStack_550 * fVar162);
      fStack_3cc = fStack_5ec * (fStack_60c + fStack_54c * fVar164);
      fStack_3c8 = fStack_5e8 * (fStack_608 + fStack_548 * fVar166);
      fStack_3c4 = fStack_604 + fStack_3e4;
      auVar234._8_4_ = 0x7f800000;
      auVar234._0_8_ = 0x7f8000007f800000;
      auVar234._12_4_ = 0x7f800000;
      auVar234._16_4_ = 0x7f800000;
      auVar234._20_4_ = 0x7f800000;
      auVar234._24_4_ = 0x7f800000;
      auVar234._28_4_ = 0x7f800000;
      local_980 = vblendvps_avx(auVar234,auVar37,auVar126);
      auVar235._8_4_ = 0xff800000;
      auVar235._0_8_ = 0xff800000ff800000;
      auVar235._12_4_ = 0xff800000;
      auVar235._16_4_ = 0xff800000;
      auVar235._20_4_ = 0xff800000;
      auVar235._24_4_ = 0xff800000;
      auVar235._28_4_ = 0xff800000;
      auVar148 = vblendvps_avx(auVar235,auVar38,auVar126);
      auVar18 = vmaxps_avx(local_5a0,local_420);
      auVar39._4_4_ = auVar18._4_4_ * 1.9073486e-06;
      auVar39._0_4_ = auVar18._0_4_ * 1.9073486e-06;
      auVar39._8_4_ = auVar18._8_4_ * 1.9073486e-06;
      auVar39._12_4_ = auVar18._12_4_ * 1.9073486e-06;
      auVar39._16_4_ = auVar18._16_4_ * 1.9073486e-06;
      auVar39._20_4_ = auVar18._20_4_ * 1.9073486e-06;
      auVar39._24_4_ = auVar18._24_4_ * 1.9073486e-06;
      auVar39._28_4_ = auVar18._28_4_;
      auVar18 = vcmpps_avx(local_a00,auVar39,1);
      auVar348 = auVar126 & auVar18;
      if ((((((((auVar348 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar348 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar348 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar348 >> 0x7f,0) != '\0') ||
            (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar348 >> 0xbf,0) != '\0') ||
          (auVar348 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar348[0x1f] < '\0') {
        auVar18 = vandps_avx(auVar18,auVar126);
        auVar174 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
        auVar348 = vcmpps_avx(auVar261,_DAT_01f7b000,2);
        auVar306._8_4_ = 0xff800000;
        auVar306._0_8_ = 0xff800000ff800000;
        auVar306._12_4_ = 0xff800000;
        auVar306._16_4_ = 0xff800000;
        auVar306._20_4_ = 0xff800000;
        auVar306._24_4_ = 0xff800000;
        auVar306._28_4_ = 0xff800000;
        auVar334._8_4_ = 0x7f800000;
        auVar334._0_8_ = 0x7f8000007f800000;
        auVar334._12_4_ = 0x7f800000;
        auVar334._16_4_ = 0x7f800000;
        auVar334._20_4_ = 0x7f800000;
        auVar334._24_4_ = 0x7f800000;
        auVar334._28_4_ = 0x7f800000;
        auVar261 = vblendvps_avx(auVar334,auVar306,auVar348);
        auVar257 = vpmovsxwd_avx(auVar174);
        auVar174 = vpunpckhwd_avx(auVar174,auVar174);
        auVar266._16_16_ = auVar174;
        auVar266._0_16_ = auVar257;
        local_980 = vblendvps_avx(local_980,auVar261,auVar266);
        auVar261 = vblendvps_avx(auVar306,auVar334,auVar348);
        auVar148 = vblendvps_avx(auVar148,auVar261,auVar266);
        auVar241._0_8_ = auVar18._0_8_ ^ 0xffffffffffffffff;
        auVar241._8_4_ = auVar18._8_4_ ^ 0xffffffff;
        auVar241._12_4_ = auVar18._12_4_ ^ 0xffffffff;
        auVar241._16_4_ = auVar18._16_4_ ^ 0xffffffff;
        auVar241._20_4_ = auVar18._20_4_ ^ 0xffffffff;
        auVar241._24_4_ = auVar18._24_4_ ^ 0xffffffff;
        auVar241._28_4_ = auVar18._28_4_ ^ 0xffffffff;
        auVar261 = vorps_avx(auVar348,auVar241);
        auVar126 = vandps_avx(auVar126,auVar261);
        auVar310 = ZEXT3264(auVar126);
      }
    }
    auVar365 = ZEXT3264(local_9a0);
    auVar126 = local_500 & auVar310._0_32_;
    auVar267 = ZEXT3264(local_9e0);
    fVar140 = (float)local_900._0_4_;
    fVar156 = (float)local_900._4_4_;
    fVar158 = fStack_8f8;
    fVar160 = fStack_8f4;
    fVar162 = fStack_8f0;
    fVar164 = fStack_8ec;
    fVar166 = fStack_8e8;
    fVar254 = fStack_8e4;
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0x7f,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0xbf,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
    {
      auVar323 = ZEXT3264(local_b20);
      auVar310 = ZEXT3264(local_a60);
    }
    else {
      fStack_5e4 = auVar87._28_4_ + auVar184._28_4_;
      auVar365 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar174 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_));
      auVar174 = vshufps_avx(auVar174,auVar174,0);
      auVar236._16_16_ = auVar174;
      auVar236._0_16_ = auVar174;
      auVar18 = vminps_avx(auVar236,auVar148);
      auVar92._0_4_ =
           (float)local_aa0._0_4_ * fVar330 +
           (float)local_820._0_4_ * fVar317 + (float)local_8e0._0_4_ * fVar342;
      auVar92._4_4_ =
           (float)local_aa0._4_4_ * fVar335 +
           (float)local_820._4_4_ * fVar324 + (float)local_8e0._4_4_ * fVar349;
      auVar92._8_4_ = fStack_a98 * fVar336 + fStack_818 * fVar325 + fStack_8d8 * fVar351;
      auVar92._12_4_ = fStack_a94 * fVar337 + fStack_814 * fVar326 + fStack_8d4 * fVar353;
      auVar92._16_4_ = fStack_a90 * fVar338 + fStack_810 * fVar327 + fStack_8d0 * fVar355;
      auVar92._20_4_ = fStack_a8c * fVar339 + fStack_80c * fVar328 + fStack_8cc * fVar357;
      auVar92._24_4_ = fStack_a88 * fVar340 + fStack_808 * fVar329 + fStack_8c8 * fVar359;
      auVar92._28_4_ = fVar361 + auVar318._28_4_ + fVar361;
      auVar87 = vrcpps_avx(auVar92);
      fVar361 = auVar87._0_4_;
      fVar271 = auVar87._4_4_;
      auVar40._4_4_ = auVar92._4_4_ * fVar271;
      auVar40._0_4_ = auVar92._0_4_ * fVar361;
      fVar275 = auVar87._8_4_;
      auVar40._8_4_ = auVar92._8_4_ * fVar275;
      fVar279 = auVar87._12_4_;
      auVar40._12_4_ = auVar92._12_4_ * fVar279;
      fVar282 = auVar87._16_4_;
      auVar40._16_4_ = auVar92._16_4_ * fVar282;
      fVar285 = auVar87._20_4_;
      auVar40._20_4_ = auVar92._20_4_ * fVar285;
      fVar288 = auVar87._24_4_;
      auVar40._24_4_ = auVar92._24_4_ * fVar288;
      auVar40._28_4_ = local_b20._28_4_ + auVar174._12_4_;
      auVar295._8_4_ = 0x3f800000;
      auVar295._0_8_ = 0x3f8000003f800000;
      auVar295._12_4_ = 0x3f800000;
      auVar295._16_4_ = 0x3f800000;
      auVar295._20_4_ = 0x3f800000;
      auVar295._24_4_ = 0x3f800000;
      auVar295._28_4_ = 0x3f800000;
      auVar348 = vsubps_avx(auVar295,auVar40);
      auVar263._8_4_ = 0x7fffffff;
      auVar263._0_8_ = 0x7fffffff7fffffff;
      auVar263._12_4_ = 0x7fffffff;
      auVar263._16_4_ = 0x7fffffff;
      auVar263._20_4_ = 0x7fffffff;
      auVar263._24_4_ = 0x7fffffff;
      auVar263._28_4_ = 0x7fffffff;
      auVar126 = vandps_avx(auVar92,auVar263);
      auVar347._8_4_ = 0x219392ef;
      auVar347._0_8_ = 0x219392ef219392ef;
      auVar347._12_4_ = 0x219392ef;
      auVar347._16_4_ = 0x219392ef;
      auVar347._20_4_ = 0x219392ef;
      auVar347._24_4_ = 0x219392ef;
      auVar347._28_4_ = 0x219392ef;
      auVar261 = vcmpps_avx(auVar126,auVar347,1);
      auVar41._4_4_ =
           (fVar271 + fVar271 * auVar348._4_4_) *
           -(fVar191 * fVar335 + fVar324 * fVar190 + fVar311 * fVar349);
      auVar41._0_4_ =
           (fVar361 + fVar361 * auVar348._0_4_) *
           -(fVar189 * fVar330 + fVar317 * fVar246 + fVar307 * fVar342);
      auVar41._8_4_ =
           (fVar275 + fVar275 * auVar348._8_4_) *
           -(fVar216 * fVar336 + fVar325 * fVar215 + fVar312 * fVar351);
      auVar41._12_4_ =
           (fVar279 + fVar279 * auVar348._12_4_) *
           -(fVar243 * fVar337 + fVar326 * fVar222 + fVar313 * fVar353);
      auVar41._16_4_ =
           (fVar282 + fVar282 * auVar348._16_4_) *
           -(fVar252 * fVar338 + fVar327 * fVar250 + fVar314 * fVar355);
      auVar41._20_4_ =
           (fVar285 + fVar285 * auVar348._20_4_) *
           -(fVar286 * fVar339 + fVar328 * fVar283 + fVar315 * fVar357);
      auVar41._24_4_ =
           (fVar288 + fVar288 * auVar348._24_4_) *
           -(fVar303 * fVar340 + fVar329 * fVar302 + fVar316 * fVar359);
      auVar41._28_4_ = auVar87._28_4_ + auVar348._28_4_;
      auVar87 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar126 = vcmpps_avx(auVar92,auVar87,1);
      auVar126 = vorps_avx(auVar261,auVar126);
      auVar305._8_4_ = 0xff800000;
      auVar305._0_8_ = 0xff800000ff800000;
      auVar305._12_4_ = 0xff800000;
      auVar305._16_4_ = 0xff800000;
      auVar305._20_4_ = 0xff800000;
      auVar305._24_4_ = 0xff800000;
      auVar305._28_4_ = 0xff800000;
      auVar126 = vblendvps_avx(auVar41,auVar305,auVar126);
      auVar87 = vcmpps_avx(auVar92,auVar87,6);
      auVar261 = vorps_avx(auVar261,auVar87);
      auVar309._8_4_ = 0x7f800000;
      auVar309._0_8_ = 0x7f8000007f800000;
      auVar309._12_4_ = 0x7f800000;
      auVar309._16_4_ = 0x7f800000;
      auVar309._20_4_ = 0x7f800000;
      auVar309._24_4_ = 0x7f800000;
      auVar309._28_4_ = 0x7f800000;
      auVar261 = vblendvps_avx(auVar41,auVar309,auVar261);
      auVar87 = vmaxps_avx(local_3c0,local_980);
      auVar87 = vmaxps_avx(auVar87,auVar126);
      auVar18 = vminps_avx(auVar18,auVar261);
      auVar348 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar126 = vsubps_avx(auVar348,auVar322);
      auVar261 = vsubps_avx(auVar348,auVar88);
      auVar42._4_4_ = auVar261._4_4_ * -fVar103;
      auVar42._0_4_ = auVar261._0_4_ * -fVar75;
      auVar42._8_4_ = auVar261._8_4_ * -fVar105;
      auVar42._12_4_ = auVar261._12_4_ * -fVar107;
      auVar42._16_4_ = auVar261._16_4_ * -fVar108;
      auVar42._20_4_ = auVar261._20_4_ * -fVar109;
      auVar42._24_4_ = auVar261._24_4_ * -fVar110;
      auVar42._28_4_ = auVar261._28_4_;
      auVar43._4_4_ = fVar276 * auVar126._4_4_;
      auVar43._0_4_ = fVar188 * auVar126._0_4_;
      auVar43._8_4_ = fVar195 * auVar126._8_4_;
      auVar43._12_4_ = fVar220 * auVar126._12_4_;
      auVar43._16_4_ = fVar249 * auVar126._16_4_;
      auVar43._20_4_ = fVar280 * auVar126._20_4_;
      auVar43._24_4_ = fVar12 * auVar126._24_4_;
      auVar43._28_4_ = auVar126._28_4_;
      auVar126 = vsubps_avx(auVar42,auVar43);
      auVar261 = vsubps_avx(auVar348,auVar16);
      auVar44._4_4_ = fVar350 * auVar261._4_4_;
      auVar44._0_4_ = fVar343 * auVar261._0_4_;
      auVar44._8_4_ = fVar352 * auVar261._8_4_;
      auVar44._12_4_ = fVar354 * auVar261._12_4_;
      auVar44._16_4_ = fVar356 * auVar261._16_4_;
      auVar44._20_4_ = fVar358 * auVar261._20_4_;
      uVar1 = auVar261._28_4_;
      auVar44._24_4_ = fVar360 * auVar261._24_4_;
      auVar44._28_4_ = uVar1;
      auVar322 = vsubps_avx(auVar126,auVar44);
      auVar45._4_4_ = (float)local_8e0._4_4_ * -fVar103;
      auVar45._0_4_ = (float)local_8e0._0_4_ * -fVar75;
      auVar45._8_4_ = fStack_8d8 * -fVar105;
      auVar45._12_4_ = fStack_8d4 * -fVar107;
      auVar45._16_4_ = fStack_8d0 * -fVar108;
      auVar45._20_4_ = fStack_8cc * -fVar109;
      auVar45._24_4_ = fStack_8c8 * -fVar110;
      auVar45._28_4_ = local_960._28_4_ ^ 0x80000000;
      auVar46._4_4_ = (float)local_820._4_4_ * fVar276;
      auVar46._0_4_ = (float)local_820._0_4_ * fVar188;
      auVar46._8_4_ = fStack_818 * fVar195;
      auVar46._12_4_ = fStack_814 * fVar220;
      auVar46._16_4_ = fStack_810 * fVar249;
      auVar46._20_4_ = fStack_80c * fVar280;
      auVar46._24_4_ = fStack_808 * fVar12;
      auVar46._28_4_ = uVar1;
      auVar319._8_4_ = 0x3f800000;
      auVar319._0_8_ = 0x3f8000003f800000;
      auVar319._12_4_ = 0x3f800000;
      auVar319._16_4_ = 0x3f800000;
      auVar319._20_4_ = 0x3f800000;
      auVar319._24_4_ = 0x3f800000;
      auVar319._28_4_ = 0x3f800000;
      auVar126 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar350 * (float)local_aa0._4_4_;
      auVar47._0_4_ = fVar343 * (float)local_aa0._0_4_;
      auVar47._8_4_ = fVar352 * fStack_a98;
      auVar47._12_4_ = fVar354 * fStack_a94;
      auVar47._16_4_ = fVar356 * fStack_a90;
      auVar47._20_4_ = fVar358 * fStack_a8c;
      auVar47._24_4_ = fVar360 * fStack_a88;
      auVar47._28_4_ = uVar1;
      auVar88 = vsubps_avx(auVar126,auVar47);
      auVar126 = vrcpps_avx(auVar88);
      fVar188 = auVar126._0_4_;
      fVar246 = auVar126._4_4_;
      auVar48._4_4_ = auVar88._4_4_ * fVar246;
      auVar48._0_4_ = auVar88._0_4_ * fVar188;
      fVar189 = auVar126._8_4_;
      auVar48._8_4_ = auVar88._8_4_ * fVar189;
      fVar276 = auVar126._12_4_;
      auVar48._12_4_ = auVar88._12_4_ * fVar276;
      fVar190 = auVar126._16_4_;
      auVar48._16_4_ = auVar88._16_4_ * fVar190;
      fVar191 = auVar126._20_4_;
      auVar48._20_4_ = auVar88._20_4_ * fVar191;
      fVar195 = auVar126._24_4_;
      auVar48._24_4_ = auVar88._24_4_ * fVar195;
      auVar48._28_4_ = fStack_8c4;
      auVar348 = vsubps_avx(auVar319,auVar48);
      auVar126 = vandps_avx(auVar88,auVar263);
      auVar264._8_4_ = 0x219392ef;
      auVar264._0_8_ = 0x219392ef219392ef;
      auVar264._12_4_ = 0x219392ef;
      auVar264._16_4_ = 0x219392ef;
      auVar264._20_4_ = 0x219392ef;
      auVar264._24_4_ = 0x219392ef;
      auVar264._28_4_ = 0x219392ef;
      auVar261 = vcmpps_avx(auVar126,auVar264,1);
      auVar49._4_4_ = (fVar246 + fVar246 * auVar348._4_4_) * -auVar322._4_4_;
      auVar49._0_4_ = (fVar188 + fVar188 * auVar348._0_4_) * -auVar322._0_4_;
      auVar49._8_4_ = (fVar189 + fVar189 * auVar348._8_4_) * -auVar322._8_4_;
      auVar49._12_4_ = (fVar276 + fVar276 * auVar348._12_4_) * -auVar322._12_4_;
      auVar49._16_4_ = (fVar190 + fVar190 * auVar348._16_4_) * -auVar322._16_4_;
      auVar49._20_4_ = (fVar191 + fVar191 * auVar348._20_4_) * -auVar322._20_4_;
      auVar49._24_4_ = (fVar195 + fVar195 * auVar348._24_4_) * -auVar322._24_4_;
      auVar49._28_4_ = auVar322._28_4_ ^ 0x80000000;
      auVar126 = vcmpps_avx(auVar88,ZEXT832(0) << 0x20,1);
      auVar126 = vorps_avx(auVar261,auVar126);
      auVar126 = vblendvps_avx(auVar49,auVar305,auVar126);
      local_840 = vmaxps_avx(auVar87,auVar126);
      auVar126 = vcmpps_avx(auVar88,ZEXT832(0) << 0x20,6);
      auVar126 = vorps_avx(auVar261,auVar126);
      auVar261 = vblendvps_avx(auVar49,auVar309,auVar126);
      auVar126 = vandps_avx(auVar310._0_32_,local_500);
      local_440 = vminps_avx(auVar18,auVar261);
      auVar261 = vcmpps_avx(local_840,local_440,2);
      auVar87 = auVar126 & auVar261;
      if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar87 >> 0x7f,0) != '\0') ||
            (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar87 >> 0xbf,0) != '\0') ||
          (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar87[0x1f] < '\0') {
        auVar87 = vminps_avx(auVar262,auVar147);
        auVar322 = vminps_avx(auVar15,auVar17);
        auVar87 = vminps_avx(auVar87,auVar322);
        auVar87 = vsubps_avx(auVar87,auVar208);
        auVar126 = vandps_avx(auVar261,auVar126);
        auVar63._4_4_ = fStack_3fc;
        auVar63._0_4_ = local_400;
        auVar63._8_4_ = fStack_3f8;
        auVar63._12_4_ = fStack_3f4;
        auVar63._16_4_ = fStack_3f0;
        auVar63._20_4_ = fStack_3ec;
        auVar63._24_4_ = fStack_3e8;
        auVar63._28_4_ = fStack_3e4;
        auVar261 = vminps_avx(auVar63,auVar319);
        auVar206 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar261 = vmaxps_avx(auVar261,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar74 + fVar111 * (auVar261._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar102 + fVar137 * (auVar261._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar104 + fVar138 * (auVar261._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar106 + fVar139 * (auVar261._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar74 + fVar111 * (auVar261._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar102 + fVar137 * (auVar261._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar104 + fVar138 * (auVar261._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar106 + auVar261._28_4_ + 7.0;
        auVar64._4_4_ = fStack_3dc;
        auVar64._0_4_ = local_3e0;
        auVar64._8_4_ = fStack_3d8;
        auVar64._12_4_ = fStack_3d4;
        auVar64._16_4_ = fStack_3d0;
        auVar64._20_4_ = fStack_3cc;
        auVar64._24_4_ = fStack_3c8;
        auVar64._28_4_ = fStack_3c4;
        auVar261 = vminps_avx(auVar64,auVar319);
        auVar261 = vmaxps_avx(auVar261,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar74 + fVar111 * (auVar261._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar102 + fVar137 * (auVar261._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar104 + fVar138 * (auVar261._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar106 + fVar139 * (auVar261._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar74 + fVar111 * (auVar261._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar102 + fVar137 * (auVar261._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar104 + fVar138 * (auVar261._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar106 + auVar261._28_4_ + 7.0;
        auVar50._4_4_ = auVar87._4_4_ * 0.99999976;
        auVar50._0_4_ = auVar87._0_4_ * 0.99999976;
        auVar50._8_4_ = auVar87._8_4_ * 0.99999976;
        auVar50._12_4_ = auVar87._12_4_ * 0.99999976;
        auVar50._16_4_ = auVar87._16_4_ * 0.99999976;
        auVar50._20_4_ = auVar87._20_4_ * 0.99999976;
        auVar50._24_4_ = auVar87._24_4_ * 0.99999976;
        auVar50._28_4_ = 0x3f7ffffc;
        auVar261 = vmaxps_avx(ZEXT832(0) << 0x20,auVar50);
        auVar51._4_4_ = auVar261._4_4_ * auVar261._4_4_;
        auVar51._0_4_ = auVar261._0_4_ * auVar261._0_4_;
        auVar51._8_4_ = auVar261._8_4_ * auVar261._8_4_;
        auVar51._12_4_ = auVar261._12_4_ * auVar261._12_4_;
        auVar51._16_4_ = auVar261._16_4_ * auVar261._16_4_;
        auVar51._20_4_ = auVar261._20_4_ * auVar261._20_4_;
        auVar51._24_4_ = auVar261._24_4_ * auVar261._24_4_;
        auVar51._28_4_ = auVar261._28_4_;
        local_ae0 = vsubps_avx(auVar19,auVar51);
        auVar52._4_4_ = local_ae0._4_4_ * fVar341 * 4.0;
        auVar52._0_4_ = local_ae0._0_4_ * fVar167 * 4.0;
        auVar52._8_4_ = local_ae0._8_4_ * fVar157 * 4.0;
        auVar52._12_4_ = local_ae0._12_4_ * fVar159 * 4.0;
        auVar52._16_4_ = local_ae0._16_4_ * fVar161 * 4.0;
        auVar52._20_4_ = local_ae0._20_4_ * fVar163 * 4.0;
        auVar52._24_4_ = local_ae0._24_4_ * fVar165 * 4.0;
        auVar52._28_4_ = auVar261._28_4_;
        auVar87 = vsubps_avx(auVar34,auVar52);
        auVar261 = vcmpps_avx(auVar87,ZEXT832(0) << 0x20,5);
        if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar261 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar261 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar261 >> 0x7f,0) == '\0') &&
              (auVar261 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar261 >> 0xbf,0) == '\0') &&
            (auVar261 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar261[0x1f]) {
          auVar260 = ZEXT828(0) << 0x20;
          auVar231 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar366 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_b60 = ZEXT832(0) << 0x20;
          auVar296._8_4_ = 0x7f800000;
          auVar296._0_8_ = 0x7f8000007f800000;
          auVar296._12_4_ = 0x7f800000;
          auVar296._16_4_ = 0x7f800000;
          auVar296._20_4_ = 0x7f800000;
          auVar296._24_4_ = 0x7f800000;
          auVar296._28_4_ = 0x7f800000;
          auVar320._8_4_ = 0xff800000;
          auVar320._0_8_ = 0xff800000ff800000;
          auVar320._12_4_ = 0xff800000;
          auVar320._16_4_ = 0xff800000;
          auVar320._20_4_ = 0xff800000;
          auVar320._24_4_ = 0xff800000;
          auVar320._28_4_ = 0xff800000;
          _local_b40 = _local_b60;
          local_ae0 = auVar16;
        }
        else {
          auVar322 = vrcpps_avx(local_340);
          fVar167 = auVar322._0_4_;
          auVar210._0_4_ = local_340._0_4_ * fVar167;
          fVar188 = auVar322._4_4_;
          auVar210._4_4_ = local_340._4_4_ * fVar188;
          fVar246 = auVar322._8_4_;
          auVar210._8_4_ = local_340._8_4_ * fVar246;
          fVar189 = auVar322._12_4_;
          auVar210._12_4_ = local_340._12_4_ * fVar189;
          fVar276 = auVar322._16_4_;
          auVar210._16_4_ = local_340._16_4_ * fVar276;
          fVar190 = auVar322._20_4_;
          auVar210._20_4_ = local_340._20_4_ * fVar190;
          fVar191 = auVar322._24_4_;
          auVar210._24_4_ = local_340._24_4_ * fVar191;
          auVar210._28_4_ = 0;
          auVar16 = vsubps_avx(auVar319,auVar210);
          auVar88 = vsqrtps_avx(auVar87);
          fVar167 = fVar167 + fVar167 * auVar16._0_4_;
          fVar188 = fVar188 + fVar188 * auVar16._4_4_;
          fVar246 = fVar246 + fVar246 * auVar16._8_4_;
          fVar189 = fVar189 + fVar189 * auVar16._12_4_;
          fVar276 = fVar276 + fVar276 * auVar16._16_4_;
          fVar190 = fVar190 + fVar190 * auVar16._20_4_;
          fVar191 = fVar191 + fVar191 * auVar16._24_4_;
          auVar17 = vsubps_avx(local_320,auVar88);
          auVar267._0_4_ = auVar17._0_4_ * fVar167;
          auVar267._4_4_ = auVar17._4_4_ * fVar188;
          auVar267._8_4_ = auVar17._8_4_ * fVar246;
          auVar267._12_4_ = auVar17._12_4_ * fVar189;
          auVar267._16_4_ = auVar17._16_4_ * fVar276;
          auVar267._20_4_ = auVar17._20_4_ * fVar190;
          auVar267._28_36_ = auVar310._28_36_;
          auVar267._24_4_ = auVar17._24_4_ * fVar191;
          auVar17 = vsubps_avx(auVar88,local_a20);
          fVar167 = auVar17._0_4_ * fVar167;
          fVar188 = auVar17._4_4_ * fVar188;
          auVar53._4_4_ = fVar188;
          auVar53._0_4_ = fVar167;
          fVar246 = auVar17._8_4_ * fVar246;
          auVar53._8_4_ = fVar246;
          fVar189 = auVar17._12_4_ * fVar189;
          auVar53._12_4_ = fVar189;
          fVar276 = auVar17._16_4_ * fVar276;
          auVar53._16_4_ = fVar276;
          fVar190 = auVar17._20_4_ * fVar190;
          auVar53._20_4_ = fVar190;
          fVar191 = auVar17._24_4_ * fVar191;
          auVar53._24_4_ = fVar191;
          auVar53._28_4_ = fVar139;
          fVar195 = (auVar267._0_4_ * local_560 + local_620) * local_600;
          fVar215 = (auVar267._4_4_ * fStack_55c + fStack_61c) * fStack_5fc;
          fVar216 = (auVar267._8_4_ * fStack_558 + fStack_618) * fStack_5f8;
          fVar220 = (auVar267._12_4_ * fStack_554 + fStack_614) * fStack_5f4;
          fVar222 = (auVar267._16_4_ * fStack_550 + fStack_610) * fStack_5f0;
          fVar243 = (auVar267._20_4_ * fStack_54c + fStack_60c) * fStack_5ec;
          fVar249 = (auVar267._24_4_ * fStack_548 + fStack_608) * fStack_5e8;
          auVar149._0_4_ = fVar253 + fVar195 * fVar244;
          auVar149._4_4_ = fVar270 + fVar215 * fVar272;
          auVar149._8_4_ = fVar274 + fVar216 * fVar194;
          auVar149._12_4_ = fVar278 + fVar220 * fVar219;
          auVar149._16_4_ = fVar281 + fVar222 * fVar248;
          auVar149._20_4_ = fVar284 + fVar243 * fVar277;
          auVar149._24_4_ = fVar287 + fVar249 * fVar11;
          auVar149._28_4_ = fVar289 + auVar322._28_4_ + auVar16._28_4_ + fStack_604;
          auVar54._4_4_ = auVar267._4_4_ * (float)local_aa0._4_4_;
          auVar54._0_4_ = auVar267._0_4_ * (float)local_aa0._0_4_;
          auVar54._8_4_ = auVar267._8_4_ * fStack_a98;
          auVar54._12_4_ = auVar267._12_4_ * fStack_a94;
          auVar54._16_4_ = auVar267._16_4_ * fStack_a90;
          auVar54._20_4_ = auVar267._20_4_ * fStack_a8c;
          auVar54._24_4_ = auVar267._24_4_ * fStack_a88;
          auVar54._28_4_ = auVar88._28_4_;
          local_9c0 = vsubps_avx(auVar54,auVar149);
          auVar237._0_4_ = auVar363._0_4_ + fVar195 * fVar242;
          auVar237._4_4_ = auVar363._4_4_ + fVar215 * fVar251;
          auVar237._8_4_ = auVar363._8_4_ + fVar216 * fVar192;
          auVar237._12_4_ = auVar363._12_4_ + fVar220 * fVar217;
          auVar237._16_4_ = auVar363._16_4_ + fVar222 * fVar245;
          auVar237._20_4_ = auVar363._20_4_ + fVar243 * fVar269;
          auVar237._24_4_ = auVar363._24_4_ + fVar249 * fVar9;
          auVar237._28_4_ = auVar363._28_4_ + auVar88._28_4_;
          auVar55._4_4_ = (float)local_820._4_4_ * auVar267._4_4_;
          auVar55._0_4_ = (float)local_820._0_4_ * auVar267._0_4_;
          auVar55._8_4_ = fStack_818 * auVar267._8_4_;
          auVar55._12_4_ = fStack_814 * auVar267._12_4_;
          auVar55._16_4_ = fStack_810 * auVar267._16_4_;
          auVar55._20_4_ = fStack_80c * auVar267._20_4_;
          auVar55._24_4_ = fStack_808 * auVar267._24_4_;
          auVar55._28_4_ = 0x3e000000;
          _local_b40 = vsubps_avx(auVar55,auVar237);
          auVar211._0_4_ = local_2e0._0_4_ + fVar187 * fVar195;
          auVar211._4_4_ = local_2e0._4_4_ + fVar268 * fVar215;
          auVar211._8_4_ = local_2e0._8_4_ + fVar193 * fVar216;
          auVar211._12_4_ = local_2e0._12_4_ + fVar218 * fVar220;
          auVar211._16_4_ = local_2e0._16_4_ + fVar247 * fVar222;
          auVar211._20_4_ = local_2e0._20_4_ + fVar273 * fVar243;
          auVar211._24_4_ = local_2e0._24_4_ + fVar10 * fVar249;
          auVar211._28_4_ = local_2e0._28_4_ + auVar17._28_4_;
          auVar56._4_4_ = auVar267._4_4_ * (float)local_8e0._4_4_;
          auVar56._0_4_ = auVar267._0_4_ * (float)local_8e0._0_4_;
          auVar56._8_4_ = auVar267._8_4_ * fStack_8d8;
          auVar56._12_4_ = auVar267._12_4_ * fStack_8d4;
          auVar56._16_4_ = auVar267._16_4_ * fStack_8d0;
          auVar56._20_4_ = auVar267._20_4_ * fStack_8cc;
          auVar56._24_4_ = auVar267._24_4_ * fStack_8c8;
          auVar56._28_4_ = auVar237._28_4_;
          _local_b60 = vsubps_avx(auVar56,auVar211);
          fVar195 = (fVar167 * local_560 + local_620) * local_600;
          fVar215 = (fVar188 * fStack_55c + fStack_61c) * fStack_5fc;
          fVar216 = (fVar246 * fStack_558 + fStack_618) * fStack_5f8;
          fVar220 = (fVar189 * fStack_554 + fStack_614) * fStack_5f4;
          fVar222 = (fVar276 * fStack_550 + fStack_610) * fStack_5f0;
          fVar243 = (fVar190 * fStack_54c + fStack_60c) * fStack_5ec;
          fVar249 = (fVar191 * fStack_548 + fStack_608) * fStack_5e8;
          auVar212._0_4_ = fVar253 + fVar195 * fVar244;
          auVar212._4_4_ = fVar270 + fVar215 * fVar272;
          auVar212._8_4_ = fVar274 + fVar216 * fVar194;
          auVar212._12_4_ = fVar278 + fVar220 * fVar219;
          auVar212._16_4_ = fVar281 + fVar222 * fVar248;
          auVar212._20_4_ = fVar284 + fVar243 * fVar277;
          auVar212._24_4_ = fVar287 + fVar249 * fVar11;
          auVar212._28_4_ = fVar289 + local_b60._28_4_ + fStack_604;
          auVar57._4_4_ = fVar188 * (float)local_aa0._4_4_;
          auVar57._0_4_ = fVar167 * (float)local_aa0._0_4_;
          auVar57._8_4_ = fVar246 * fStack_a98;
          auVar57._12_4_ = fVar189 * fStack_a94;
          auVar57._16_4_ = fVar276 * fStack_a90;
          auVar57._20_4_ = fVar190 * fStack_a8c;
          auVar57._24_4_ = fVar191 * fStack_a88;
          auVar57._28_4_ = 0x3e000000;
          auVar322 = vsubps_avx(auVar57,auVar212);
          auVar206 = auVar322._0_28_;
          auVar265._0_4_ = auVar363._0_4_ + fVar195 * fVar242;
          auVar265._4_4_ = auVar363._4_4_ + fVar215 * fVar251;
          auVar265._8_4_ = auVar363._8_4_ + fVar216 * fVar192;
          auVar265._12_4_ = auVar363._12_4_ + fVar220 * fVar217;
          auVar265._16_4_ = auVar363._16_4_ + fVar222 * fVar245;
          auVar265._20_4_ = auVar363._20_4_ + fVar243 * fVar269;
          auVar265._24_4_ = auVar363._24_4_ + fVar249 * fVar9;
          auVar265._28_4_ = auVar363._28_4_ + 0.125;
          auVar58._4_4_ = (float)local_820._4_4_ * fVar188;
          auVar58._0_4_ = (float)local_820._0_4_ * fVar167;
          auVar58._8_4_ = fStack_818 * fVar246;
          auVar58._12_4_ = fStack_814 * fVar189;
          auVar58._16_4_ = fStack_810 * fVar276;
          auVar58._20_4_ = fStack_80c * fVar190;
          auVar58._24_4_ = fStack_808 * fVar191;
          auVar58._28_4_ = fStack_a84;
          auVar322 = vsubps_avx(auVar58,auVar265);
          auVar260 = auVar322._0_28_;
          auVar238._0_4_ = local_2e0._0_4_ + fVar187 * fVar195;
          auVar238._4_4_ = local_2e0._4_4_ + fVar268 * fVar215;
          auVar238._8_4_ = local_2e0._8_4_ + fVar193 * fVar216;
          auVar238._12_4_ = local_2e0._12_4_ + fVar218 * fVar220;
          auVar238._16_4_ = local_2e0._16_4_ + fVar247 * fVar222;
          auVar238._20_4_ = local_2e0._20_4_ + fVar273 * fVar243;
          auVar238._24_4_ = local_2e0._24_4_ + fVar10 * fVar249;
          auVar238._28_4_ = local_2e0._28_4_ + auVar237._28_4_;
          auVar59._4_4_ = fVar188 * (float)local_8e0._4_4_;
          auVar59._0_4_ = fVar167 * (float)local_8e0._0_4_;
          auVar59._8_4_ = fVar246 * fStack_8d8;
          auVar59._12_4_ = fVar189 * fStack_8d4;
          auVar59._16_4_ = fVar276 * fStack_8d0;
          auVar59._20_4_ = fVar190 * fStack_8cc;
          auVar59._24_4_ = fVar191 * fStack_8c8;
          auVar59._28_4_ = fStack_a84;
          auVar322 = vsubps_avx(auVar59,auVar238);
          auVar231 = auVar322._0_28_;
          auVar87 = vcmpps_avx(auVar87,ZEXT832(0) << 0x20,5);
          auVar297._8_4_ = 0x7f800000;
          auVar297._0_8_ = 0x7f8000007f800000;
          auVar297._12_4_ = 0x7f800000;
          auVar297._16_4_ = 0x7f800000;
          auVar297._20_4_ = 0x7f800000;
          auVar297._24_4_ = 0x7f800000;
          auVar297._28_4_ = 0x7f800000;
          auVar296 = vblendvps_avx(auVar297,auVar267._0_32_,auVar87);
          auVar322 = vmaxps_avx(local_5a0,local_420);
          auVar60._4_4_ = auVar322._4_4_ * 1.9073486e-06;
          auVar60._0_4_ = auVar322._0_4_ * 1.9073486e-06;
          auVar60._8_4_ = auVar322._8_4_ * 1.9073486e-06;
          auVar60._12_4_ = auVar322._12_4_ * 1.9073486e-06;
          auVar60._16_4_ = auVar322._16_4_ * 1.9073486e-06;
          auVar60._20_4_ = auVar322._20_4_ * 1.9073486e-06;
          auVar60._24_4_ = auVar322._24_4_ * 1.9073486e-06;
          auVar60._28_4_ = auVar322._28_4_;
          auVar322 = vcmpps_avx(local_a00,auVar60,1);
          auVar321._8_4_ = 0xff800000;
          auVar321._0_8_ = 0xff800000ff800000;
          auVar321._12_4_ = 0xff800000;
          auVar321._16_4_ = 0xff800000;
          auVar321._20_4_ = 0xff800000;
          auVar321._24_4_ = 0xff800000;
          auVar321._28_4_ = 0xff800000;
          auVar320 = vblendvps_avx(auVar321,auVar53,auVar87);
          auVar88 = auVar87 & auVar322;
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar261 = vandps_avx(auVar322,auVar87);
            auVar174 = vpackssdw_avx(auVar261._0_16_,auVar261._16_16_);
            auVar88 = vcmpps_avx(local_ae0,_DAT_01f7b000,2);
            auVar136._8_4_ = 0xff800000;
            auVar136._0_8_ = 0xff800000ff800000;
            auVar136._12_4_ = 0xff800000;
            auVar136._16_4_ = 0xff800000;
            auVar136._20_4_ = 0xff800000;
            auVar136._24_4_ = 0xff800000;
            auVar136._28_4_ = 0xff800000;
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar322 = vblendvps_avx(auVar155,auVar136,auVar88);
            auVar257 = vpmovsxwd_avx(auVar174);
            auVar174 = vpunpckhwd_avx(auVar174,auVar174);
            auVar364._16_16_ = auVar174;
            auVar364._0_16_ = auVar257;
            auVar296 = vblendvps_avx(auVar296,auVar322,auVar364);
            auVar322 = vblendvps_avx(auVar136,auVar155,auVar88);
            auVar320 = vblendvps_avx(auVar320,auVar322,auVar364);
            auVar186._0_8_ = auVar261._0_8_ ^ 0xffffffffffffffff;
            auVar186._8_4_ = auVar261._8_4_ ^ 0xffffffff;
            auVar186._12_4_ = auVar261._12_4_ ^ 0xffffffff;
            auVar186._16_4_ = auVar261._16_4_ ^ 0xffffffff;
            auVar186._20_4_ = auVar261._20_4_ ^ 0xffffffff;
            auVar186._24_4_ = auVar261._24_4_ ^ 0xffffffff;
            auVar186._28_4_ = auVar261._28_4_ ^ 0xffffffff;
            auVar261 = vorps_avx(auVar88,auVar186);
            auVar261 = vandps_avx(auVar87,auVar261);
          }
          auVar366 = local_9c0._0_28_;
        }
        _local_4a0 = local_840;
        local_480 = vminps_avx(local_440,auVar296);
        _local_880 = vmaxps_avx(local_840,auVar320);
        _local_460 = _local_880;
        auVar87 = vcmpps_avx(local_840,local_480,2);
        local_780 = vandps_avx(auVar126,auVar87);
        auVar87 = vcmpps_avx(_local_880,local_440,2);
        local_8c0 = vandps_avx(auVar126,auVar87);
        auVar126 = vorps_avx(local_8c0,local_780);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0x7f,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar126 >> 0xbf,0) != '\0') ||
            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar126[0x1f] < '\0') {
          auStack_918 = auVar15._8_24_;
          auVar128._0_8_ = auVar261._0_8_ ^ 0xffffffffffffffff;
          auVar128._8_4_ = auVar261._8_4_ ^ 0xffffffff;
          auVar128._12_4_ = auVar261._12_4_ ^ 0xffffffff;
          auVar128._16_4_ = auVar261._16_4_ ^ 0xffffffff;
          auVar128._20_4_ = auVar261._20_4_ ^ 0xffffffff;
          auVar128._24_4_ = auVar261._24_4_ ^ 0xffffffff;
          fVar167 = auVar261._28_4_;
          auVar128._28_4_ = (uint)fVar167 ^ 0xffffffff;
          auVar94._0_4_ =
               (float)local_aa0._0_4_ * auVar206._0_4_ +
               (float)local_820._0_4_ * auVar260._0_4_ + (float)local_8e0._0_4_ * auVar231._0_4_;
          auVar94._4_4_ =
               (float)local_aa0._4_4_ * auVar206._4_4_ +
               (float)local_820._4_4_ * auVar260._4_4_ + (float)local_8e0._4_4_ * auVar231._4_4_;
          auVar94._8_4_ =
               fStack_a98 * auVar206._8_4_ +
               fStack_818 * auVar260._8_4_ + fStack_8d8 * auVar231._8_4_;
          auVar94._12_4_ =
               fStack_a94 * auVar206._12_4_ +
               fStack_814 * auVar260._12_4_ + fStack_8d4 * auVar231._12_4_;
          auVar94._16_4_ =
               fStack_a90 * auVar206._16_4_ +
               fStack_810 * auVar260._16_4_ + fStack_8d0 * auVar231._16_4_;
          auVar94._20_4_ =
               fStack_a8c * auVar206._20_4_ +
               fStack_80c * auVar260._20_4_ + fStack_8cc * auVar231._20_4_;
          auVar94._24_4_ =
               fStack_a88 * auVar206._24_4_ +
               fStack_808 * auVar260._24_4_ + fStack_8c8 * auVar231._24_4_;
          auVar94._28_4_ = fVar167 + local_8c0._28_4_ + auVar126._28_4_;
          auVar213._8_4_ = 0x7fffffff;
          auVar213._0_8_ = 0x7fffffff7fffffff;
          auVar213._12_4_ = 0x7fffffff;
          auVar213._16_4_ = 0x7fffffff;
          auVar213._20_4_ = 0x7fffffff;
          auVar213._24_4_ = 0x7fffffff;
          auVar213._28_4_ = 0x7fffffff;
          auVar126 = vandps_avx(auVar94,auVar213);
          auVar239._8_4_ = 0x3e99999a;
          auVar239._0_8_ = 0x3e99999a3e99999a;
          auVar239._12_4_ = 0x3e99999a;
          auVar239._16_4_ = 0x3e99999a;
          auVar239._20_4_ = 0x3e99999a;
          auVar239._24_4_ = 0x3e99999a;
          auVar239._28_4_ = 0x3e99999a;
          auVar126 = vcmpps_avx(auVar126,auVar239,1);
          local_7c0 = vorps_avx(auVar126,auVar128);
          auVar95._0_4_ =
               auVar366._0_4_ * (float)local_aa0._0_4_ +
               (float)local_820._0_4_ * (float)local_b40._0_4_ +
               (float)local_8e0._0_4_ * (float)local_b60._0_4_;
          auVar95._4_4_ =
               auVar366._4_4_ * (float)local_aa0._4_4_ +
               (float)local_820._4_4_ * (float)local_b40._4_4_ +
               (float)local_8e0._4_4_ * (float)local_b60._4_4_;
          auVar95._8_4_ =
               auVar366._8_4_ * fStack_a98 + fStack_818 * fStack_b38 + fStack_8d8 * fStack_b58;
          auVar95._12_4_ =
               auVar366._12_4_ * fStack_a94 + fStack_814 * fStack_b34 + fStack_8d4 * fStack_b54;
          auVar95._16_4_ =
               auVar366._16_4_ * fStack_a90 + fStack_810 * fStack_b30 + fStack_8d0 * fStack_b50;
          auVar95._20_4_ =
               auVar366._20_4_ * fStack_a8c + fStack_80c * fStack_b2c + fStack_8cc * fStack_b4c;
          auVar95._24_4_ =
               auVar366._24_4_ * fStack_a88 + fStack_808 * fStack_b28 + fStack_8c8 * fStack_b48;
          auVar95._28_4_ = local_7c0._28_4_ + local_780._28_4_ + fVar167;
          auVar126 = vandps_avx(auVar95,auVar213);
          auVar126 = vcmpps_avx(auVar126,auVar239,1);
          auVar126 = vorps_avx(auVar126,auVar128);
          auVar129._8_4_ = 3;
          auVar129._0_8_ = 0x300000003;
          auVar129._12_4_ = 3;
          auVar129._16_4_ = 3;
          auVar129._20_4_ = 3;
          auVar129._24_4_ = 3;
          auVar129._28_4_ = 3;
          auVar151._8_4_ = 2;
          auVar151._0_8_ = 0x200000002;
          auVar151._12_4_ = 2;
          auVar151._16_4_ = 2;
          auVar151._20_4_ = 2;
          auVar151._24_4_ = 2;
          auVar151._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar151,auVar129,auVar126);
          local_7e0 = ZEXT432(local_d04);
          local_800 = vpshufd_avx(ZEXT416(local_d04),0);
          auVar174 = vpcmpgtd_avx(auVar126._16_16_,local_800);
          auStack_7f0 = auVar208._16_16_;
          auVar257 = vpcmpgtd_avx(auVar126._0_16_,local_800);
          auVar130._16_16_ = auVar174;
          auVar130._0_16_ = auVar257;
          local_7a0 = vblendps_avx(ZEXT1632(auVar257),auVar130,0xf0);
          auVar126 = vandnps_avx(local_7a0,local_780);
          local_8a0._4_4_ = local_840._4_4_ + (float)local_900._4_4_;
          local_8a0._0_4_ = local_840._0_4_ + (float)local_900._0_4_;
          fStack_898 = local_840._8_4_ + fStack_8f8;
          fStack_894 = local_840._12_4_ + fStack_8f4;
          fStack_890 = local_840._16_4_ + fStack_8f0;
          fStack_88c = local_840._20_4_ + fStack_8ec;
          fStack_888 = local_840._24_4_ + fStack_8e8;
          fStack_884 = local_840._28_4_ + fStack_8e4;
          while( true ) {
            local_4c0 = auVar126;
            if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0x7f,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar126 >> 0xbf,0) == '\0') &&
                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar126[0x1f]) break;
            auVar131._8_4_ = 0x7f800000;
            auVar131._0_8_ = 0x7f8000007f800000;
            auVar131._12_4_ = 0x7f800000;
            auVar131._16_4_ = 0x7f800000;
            auVar131._20_4_ = 0x7f800000;
            auVar131._24_4_ = 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar261 = vblendvps_avx(auVar131,local_840,auVar126);
            auVar87 = vshufps_avx(auVar261,auVar261,0xb1);
            auVar87 = vminps_avx(auVar261,auVar87);
            auVar322 = vshufpd_avx(auVar87,auVar87,5);
            auVar87 = vminps_avx(auVar87,auVar322);
            auVar322 = vperm2f128_avx(auVar87,auVar87,1);
            auVar87 = vminps_avx(auVar87,auVar322);
            auVar261 = vcmpps_avx(auVar261,auVar87,0);
            auVar87 = auVar126 & auVar261;
            if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar87 >> 0x7f,0) != '\0') ||
                  (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0xbf,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar87[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar261,auVar126);
            }
            uVar66 = vmovmskps_avx(auVar126);
            uVar70 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar68 = (ulong)uVar70;
            *(undefined4 *)(local_4c0 + uVar68 * 4) = 0;
            fVar167 = local_1a0[uVar68];
            uVar70 = *(uint *)(local_4a0 + uVar68 * 4);
            fVar242 = auVar114._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              fVar242 = sqrtf((float)local_a40._0_4_);
            }
            auVar257 = vminps_avx(_local_ba0,_local_bc0);
            auVar174 = vmaxps_avx(_local_ba0,_local_bc0);
            auVar14 = vminps_avx(_local_bb0,_local_bd0);
            auVar80 = vminps_avx(auVar257,auVar14);
            auVar257 = vmaxps_avx(_local_bb0,_local_bd0);
            auVar14 = vmaxps_avx(auVar174,auVar257);
            auVar170._8_4_ = 0x7fffffff;
            auVar170._0_8_ = 0x7fffffff7fffffff;
            auVar170._12_4_ = 0x7fffffff;
            auVar174 = vandps_avx(auVar80,auVar170);
            auVar257 = vandps_avx(auVar14,auVar170);
            auVar174 = vmaxps_avx(auVar174,auVar257);
            auVar257 = vmovshdup_avx(auVar174);
            auVar257 = vmaxss_avx(auVar257,auVar174);
            auVar174 = vshufpd_avx(auVar174,auVar174,1);
            auVar174 = vmaxss_avx(auVar174,auVar257);
            local_b40._0_4_ = auVar174._0_4_ * 1.9073486e-06;
            local_ae0._0_4_ = fVar242 * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar14,auVar14,0xff);
            auVar174 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar167),0x10);
            auVar267 = ZEXT1664(auVar174);
            lVar67 = 5;
            do {
              do {
                bVar73 = lVar67 == 0;
                lVar67 = lVar67 + -1;
                if (bVar73) goto LAB_0083cdf7;
                auVar257 = auVar267._0_16_;
                auVar174 = vmovshdup_avx(auVar257);
                fVar192 = auVar174._0_4_;
                fVar188 = 1.0 - fVar192;
                auVar174 = vshufps_avx(auVar257,auVar257,0x55);
                fVar167 = auVar174._0_4_;
                fVar242 = auVar174._4_4_;
                fVar187 = auVar174._8_4_;
                fVar244 = auVar174._12_4_;
                auVar174 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
                fVar246 = auVar174._0_4_;
                fVar189 = auVar174._4_4_;
                fVar251 = auVar174._8_4_;
                fVar268 = auVar174._12_4_;
                fVar272 = (float)local_bb0._0_4_ * fVar167 + (float)local_bc0._0_4_ * fVar246;
                fVar276 = (float)local_bb0._4_4_ * fVar242 + (float)local_bc0._4_4_ * fVar189;
                fVar190 = fStack_ba8 * fVar187 + fStack_bb8 * fVar251;
                fVar191 = fStack_ba4 * fVar244 + fStack_bb4 * fVar268;
                auVar226._0_4_ =
                     fVar246 * ((float)local_bc0._0_4_ * fVar167 + fVar246 * (float)local_ba0._0_4_)
                     + fVar167 * fVar272;
                auVar226._4_4_ =
                     fVar189 * ((float)local_bc0._4_4_ * fVar242 + fVar189 * (float)local_ba0._4_4_)
                     + fVar242 * fVar276;
                auVar226._8_4_ =
                     fVar251 * (fStack_bb8 * fVar187 + fVar251 * fStack_b98) + fVar187 * fVar190;
                auVar226._12_4_ =
                     fVar268 * (fStack_bb4 * fVar244 + fVar268 * fStack_b94) + fVar244 * fVar191;
                auVar171._0_4_ =
                     fVar246 * fVar272 +
                     fVar167 * (fVar167 * (float)local_bd0._0_4_ + (float)local_bb0._0_4_ * fVar246)
                ;
                auVar171._4_4_ =
                     fVar189 * fVar276 +
                     fVar242 * (fVar242 * (float)local_bd0._4_4_ + (float)local_bb0._4_4_ * fVar189)
                ;
                auVar171._8_4_ =
                     fVar251 * fVar190 + fVar187 * (fVar187 * fStack_bc8 + fStack_ba8 * fVar251);
                auVar171._12_4_ =
                     fVar268 * fVar191 + fVar244 * (fVar244 * fStack_bc4 + fStack_ba4 * fVar268);
                auVar174 = vshufps_avx(auVar257,auVar257,0);
                auVar116._0_4_ = auVar174._0_4_ * (float)local_a30._0_4_ + 0.0;
                auVar116._4_4_ = auVar174._4_4_ * (float)local_a30._4_4_ + 0.0;
                auVar116._8_4_ = auVar174._8_4_ * fStack_a28 + 0.0;
                auVar116._12_4_ = auVar174._12_4_ * fStack_a24 + 0.0;
                auVar79._0_4_ = fVar246 * auVar226._0_4_ + fVar167 * auVar171._0_4_;
                auVar79._4_4_ = fVar189 * auVar226._4_4_ + fVar242 * auVar171._4_4_;
                auVar79._8_4_ = fVar251 * auVar226._8_4_ + fVar187 * auVar171._8_4_;
                auVar79._12_4_ = fVar268 * auVar226._12_4_ + fVar244 * auVar171._12_4_;
                local_9c0._0_16_ = auVar79;
                auVar174 = vsubps_avx(auVar116,auVar79);
                _local_b60 = auVar174;
                auVar174 = vdpps_avx(auVar174,auVar174,0x7f);
                fVar167 = auVar174._0_4_;
                if (fVar167 < 0.0) {
                  local_b00._0_16_ = auVar171;
                  fVar242 = sqrtf(fVar167);
                  auVar267 = ZEXT1664(auVar257);
                  auVar171 = local_b00._0_16_;
                }
                else {
                  auVar14 = vsqrtss_avx(auVar174,auVar174);
                  fVar242 = auVar14._0_4_;
                }
                auVar14 = vsubps_avx(auVar171,auVar226);
                auVar293._0_4_ = auVar14._0_4_ * 3.0;
                auVar293._4_4_ = auVar14._4_4_ * 3.0;
                auVar293._8_4_ = auVar14._8_4_ * 3.0;
                auVar293._12_4_ = auVar14._12_4_ * 3.0;
                auVar14 = vshufps_avx(ZEXT416((uint)(fVar192 * 6.0)),ZEXT416((uint)(fVar192 * 6.0)),
                                      0);
                auVar80 = ZEXT416((uint)((fVar188 - (fVar192 + fVar192)) * 6.0));
                auVar77 = vshufps_avx(auVar80,auVar80,0);
                auVar80 = ZEXT416((uint)((fVar192 - (fVar188 + fVar188)) * 6.0));
                auVar113 = vshufps_avx(auVar80,auVar80,0);
                auVar76 = vshufps_avx(ZEXT416((uint)(fVar188 * 6.0)),ZEXT416((uint)(fVar188 * 6.0)),
                                      0);
                auVar80 = vdpps_avx(auVar293,auVar293,0x7f);
                auVar117._0_4_ =
                     auVar76._0_4_ * (float)local_ba0._0_4_ +
                     auVar113._0_4_ * (float)local_bc0._0_4_ +
                     auVar14._0_4_ * (float)local_bd0._0_4_ + auVar77._0_4_ * (float)local_bb0._0_4_
                ;
                auVar117._4_4_ =
                     auVar76._4_4_ * (float)local_ba0._4_4_ +
                     auVar113._4_4_ * (float)local_bc0._4_4_ +
                     auVar14._4_4_ * (float)local_bd0._4_4_ + auVar77._4_4_ * (float)local_bb0._4_4_
                ;
                auVar117._8_4_ =
                     auVar76._8_4_ * fStack_b98 +
                     auVar113._8_4_ * fStack_bb8 +
                     auVar14._8_4_ * fStack_bc8 + auVar77._8_4_ * fStack_ba8;
                auVar117._12_4_ =
                     auVar76._12_4_ * fStack_b94 +
                     auVar113._12_4_ * fStack_bb4 +
                     auVar14._12_4_ * fStack_bc4 + auVar77._12_4_ * fStack_ba4;
                auVar14 = vblendps_avx(auVar80,_DAT_01f45a50,0xe);
                auVar77 = vrsqrtss_avx(auVar14,auVar14);
                fVar244 = auVar77._0_4_;
                fVar187 = auVar80._0_4_;
                auVar77 = vdpps_avx(auVar293,auVar117,0x7f);
                auVar113 = vshufps_avx(auVar80,auVar80,0);
                auVar118._0_4_ = auVar117._0_4_ * auVar113._0_4_;
                auVar118._4_4_ = auVar117._4_4_ * auVar113._4_4_;
                auVar118._8_4_ = auVar117._8_4_ * auVar113._8_4_;
                auVar118._12_4_ = auVar117._12_4_ * auVar113._12_4_;
                auVar77 = vshufps_avx(auVar77,auVar77,0);
                auVar198._0_4_ = auVar293._0_4_ * auVar77._0_4_;
                auVar198._4_4_ = auVar293._4_4_ * auVar77._4_4_;
                auVar198._8_4_ = auVar293._8_4_ * auVar77._8_4_;
                auVar198._12_4_ = auVar293._12_4_ * auVar77._12_4_;
                auVar76 = vsubps_avx(auVar118,auVar198);
                auVar77 = vrcpss_avx(auVar14,auVar14);
                auVar14 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                     ZEXT416((uint)(auVar267._0_4_ * (float)local_ae0._0_4_)));
                auVar77 = ZEXT416((uint)(auVar77._0_4_ * (2.0 - fVar187 * auVar77._0_4_)));
                auVar77 = vshufps_avx(auVar77,auVar77,0);
                uVar68 = CONCAT44(auVar293._4_4_,auVar293._0_4_);
                auVar227._0_8_ = uVar68 ^ 0x8000000080000000;
                auVar227._8_4_ = -auVar293._8_4_;
                auVar227._12_4_ = -auVar293._12_4_;
                auVar113 = ZEXT416((uint)(fVar244 * 1.5 +
                                         fVar187 * -0.5 * fVar244 * fVar244 * fVar244));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar172._0_4_ = auVar113._0_4_ * auVar76._0_4_ * auVar77._0_4_;
                auVar172._4_4_ = auVar113._4_4_ * auVar76._4_4_ * auVar77._4_4_;
                auVar172._8_4_ = auVar113._8_4_ * auVar76._8_4_ * auVar77._8_4_;
                auVar172._12_4_ = auVar113._12_4_ * auVar76._12_4_ * auVar77._12_4_;
                auVar258._0_4_ = auVar293._0_4_ * auVar113._0_4_;
                auVar258._4_4_ = auVar293._4_4_ * auVar113._4_4_;
                auVar258._8_4_ = auVar293._8_4_ * auVar113._8_4_;
                auVar258._12_4_ = auVar293._12_4_ * auVar113._12_4_;
                if (fVar187 < 0.0) {
                  local_b00._0_16_ = auVar227;
                  local_960._0_16_ = auVar258;
                  local_a80._0_16_ = auVar172;
                  fVar187 = sqrtf(fVar187);
                  auVar172 = local_a80._0_16_;
                  auVar227 = local_b00._0_16_;
                  auVar258 = local_960._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar187 = auVar80._0_4_;
                }
                auVar80 = vdpps_avx(_local_b60,auVar258,0x7f);
                fVar242 = ((float)local_b40._0_4_ / fVar187) * (fVar242 + 1.0) +
                          auVar14._0_4_ + fVar242 * (float)local_b40._0_4_;
                auVar77 = vdpps_avx(auVar227,auVar258,0x7f);
                auVar113 = vdpps_avx(_local_b60,auVar172,0x7f);
                auVar76 = vdpps_avx(_local_a30,auVar258,0x7f);
                auVar112 = vdpps_avx(_local_b60,auVar227,0x7f);
                fVar187 = auVar77._0_4_ + auVar113._0_4_;
                fVar244 = auVar80._0_4_;
                auVar81._0_4_ = fVar244 * fVar244;
                auVar81._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar81._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar81._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar113 = vsubps_avx(auVar174,auVar81);
                auVar77 = vdpps_avx(_local_b60,_local_a30,0x7f);
                fVar188 = auVar112._0_4_ - fVar244 * fVar187;
                fVar246 = auVar77._0_4_ - fVar244 * auVar76._0_4_;
                auVar77 = vrsqrtss_avx(auVar113,auVar113);
                fVar189 = auVar113._0_4_;
                fVar244 = auVar77._0_4_;
                fVar244 = fVar244 * 1.5 + fVar189 * -0.5 * fVar244 * fVar244 * fVar244;
                if (fVar189 < 0.0) {
                  local_b00._0_4_ = fVar242;
                  local_960._0_16_ = auVar76;
                  local_a80._0_16_ = ZEXT416((uint)fVar187);
                  local_980._0_4_ = fVar188;
                  local_a00._0_4_ = fVar246;
                  local_a20._0_4_ = fVar244;
                  fVar189 = sqrtf(fVar189);
                  fVar244 = (float)local_a20._0_4_;
                  fVar188 = (float)local_980._0_4_;
                  fVar246 = (float)local_a00._0_4_;
                  auVar76 = local_960._0_16_;
                  fVar242 = (float)local_b00._0_4_;
                  auVar77 = local_a80._0_16_;
                }
                else {
                  auVar77 = vsqrtss_avx(auVar113,auVar113);
                  fVar189 = auVar77._0_4_;
                  auVar77 = ZEXT416((uint)fVar187);
                }
                auVar112 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar85 = vshufps_avx(auVar293,auVar293,0xff);
                fVar187 = fVar188 * fVar244 - auVar85._0_4_;
                auVar199._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar199._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar199._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar228._0_4_ = -fVar187;
                auVar228._4_4_ = 0x80000000;
                auVar228._8_4_ = 0x80000000;
                auVar228._12_4_ = 0x80000000;
                auVar113 = vinsertps_avx(auVar228,ZEXT416((uint)(fVar246 * fVar244)),0x1c);
                auVar76 = vmovsldup_avx(ZEXT416((uint)(auVar77._0_4_ * fVar246 * fVar244 -
                                                      auVar76._0_4_ * fVar187)));
                auVar113 = vdivps_avx(auVar113,auVar76);
                auVar77 = vinsertps_avx(auVar77,auVar199,0x10);
                auVar77 = vdivps_avx(auVar77,auVar76);
                auVar76 = vmovsldup_avx(auVar80);
                auVar82 = ZEXT416((uint)(fVar189 - auVar112._0_4_));
                auVar112 = vmovsldup_avx(auVar82);
                auVar143._0_4_ = auVar76._0_4_ * auVar113._0_4_ + auVar112._0_4_ * auVar77._0_4_;
                auVar143._4_4_ = auVar76._4_4_ * auVar113._4_4_ + auVar112._4_4_ * auVar77._4_4_;
                auVar143._8_4_ = auVar76._8_4_ * auVar113._8_4_ + auVar112._8_4_ * auVar77._8_4_;
                auVar143._12_4_ =
                     auVar76._12_4_ * auVar113._12_4_ + auVar112._12_4_ * auVar77._12_4_;
                auVar77 = vsubps_avx(auVar257,auVar143);
                auVar267 = ZEXT1664(auVar77);
                auVar144._8_4_ = 0x7fffffff;
                auVar144._0_8_ = 0x7fffffff7fffffff;
                auVar144._12_4_ = 0x7fffffff;
                auVar257 = vandps_avx(auVar80,auVar144);
              } while (fVar242 <= auVar257._0_4_);
              auVar173._8_4_ = 0x7fffffff;
              auVar173._0_8_ = 0x7fffffff7fffffff;
              auVar173._12_4_ = 0x7fffffff;
              auVar257 = vandps_avx(auVar82,auVar173);
            } while ((float)local_860._0_4_ * 1.9073486e-06 + auVar14._0_4_ + fVar242 <=
                     auVar257._0_4_);
            fVar242 = auVar77._0_4_ + (float)local_940._0_4_;
            if ((fVar221 <= fVar242) &&
               (fVar187 = *(float *)(ray + k * 4 + 0x100), fVar242 <= fVar187)) {
              auVar257 = vmovshdup_avx(auVar77);
              fVar244 = auVar257._0_4_;
              if ((0.0 <= fVar244) && (fVar244 <= 1.0)) {
                auVar174 = vrsqrtss_avx(auVar174,auVar174);
                fVar188 = auVar174._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar65].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar174 = ZEXT416((uint)(fVar188 * 1.5 +
                                           fVar167 * -0.5 * fVar188 * fVar188 * fVar188));
                  auVar174 = vshufps_avx(auVar174,auVar174,0);
                  auVar175._0_4_ = auVar174._0_4_ * (float)local_b60._0_4_;
                  auVar175._4_4_ = auVar174._4_4_ * (float)local_b60._4_4_;
                  auVar175._8_4_ = auVar174._8_4_ * fStack_b58;
                  auVar175._12_4_ = auVar174._12_4_ * fStack_b54;
                  auVar119._0_4_ = auVar293._0_4_ + auVar85._0_4_ * auVar175._0_4_;
                  auVar119._4_4_ = auVar293._4_4_ + auVar85._4_4_ * auVar175._4_4_;
                  auVar119._8_4_ = auVar293._8_4_ + auVar85._8_4_ * auVar175._8_4_;
                  auVar119._12_4_ = auVar293._12_4_ + auVar85._12_4_ * auVar175._12_4_;
                  auVar174 = vshufps_avx(auVar175,auVar175,0xc9);
                  auVar257 = vshufps_avx(auVar293,auVar293,0xc9);
                  auVar176._0_4_ = auVar257._0_4_ * auVar175._0_4_;
                  auVar176._4_4_ = auVar257._4_4_ * auVar175._4_4_;
                  auVar176._8_4_ = auVar257._8_4_ * auVar175._8_4_;
                  auVar176._12_4_ = auVar257._12_4_ * auVar175._12_4_;
                  auVar200._0_4_ = auVar293._0_4_ * auVar174._0_4_;
                  auVar200._4_4_ = auVar293._4_4_ * auVar174._4_4_;
                  auVar200._8_4_ = auVar293._8_4_ * auVar174._8_4_;
                  auVar200._12_4_ = auVar293._12_4_ * auVar174._12_4_;
                  auVar14 = vsubps_avx(auVar200,auVar176);
                  auVar174 = vshufps_avx(auVar14,auVar14,0xc9);
                  auVar257 = vshufps_avx(auVar119,auVar119,0xc9);
                  auVar201._0_4_ = auVar257._0_4_ * auVar174._0_4_;
                  auVar201._4_4_ = auVar257._4_4_ * auVar174._4_4_;
                  auVar201._8_4_ = auVar257._8_4_ * auVar174._8_4_;
                  auVar201._12_4_ = auVar257._12_4_ * auVar174._12_4_;
                  auVar174 = vshufps_avx(auVar14,auVar14,0xd2);
                  auVar120._0_4_ = auVar119._0_4_ * auVar174._0_4_;
                  auVar120._4_4_ = auVar119._4_4_ * auVar174._4_4_;
                  auVar120._8_4_ = auVar119._8_4_ * auVar174._8_4_;
                  auVar120._12_4_ = auVar119._12_4_ * auVar174._12_4_;
                  auVar174 = vsubps_avx(auVar201,auVar120);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar242;
                    uVar1 = vextractps_avx(auVar174,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                    uVar1 = vextractps_avx(auVar174,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar174._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar244;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_920;
                    *(uint *)(ray + k * 4 + 0x240) = uVar65;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar6 = context->user;
                    auStack_6d0 = vshufps_avx(auVar77,auVar77,0x55);
                    auStack_730 = vshufps_avx(auVar174,auVar174,0x55);
                    auStack_710 = vshufps_avx(auVar174,auVar174,0xaa);
                    auStack_6f0 = vshufps_avx(auVar174,auVar174,0);
                    local_740 = (RTCHitN  [16])auStack_730;
                    local_720 = auStack_710;
                    local_700 = auStack_6f0;
                    local_6e0 = auStack_6d0;
                    local_6c0 = ZEXT832(0) << 0x20;
                    local_6a0 = local_5e0._0_8_;
                    uStack_698 = local_5e0._8_8_;
                    uStack_690 = local_5e0._16_8_;
                    uStack_688 = local_5e0._24_8_;
                    local_680 = local_5c0;
                    auVar126 = vcmpps_avx(local_5c0,local_5c0,0xf);
                    local_aa8[1] = auVar126;
                    *local_aa8 = auVar126;
                    local_660 = pRVar6->instID[0];
                    uStack_65c = local_660;
                    uStack_658 = local_660;
                    uStack_654 = local_660;
                    uStack_650 = local_660;
                    uStack_64c = local_660;
                    uStack_648 = local_660;
                    uStack_644 = local_660;
                    local_640 = pRVar6->instPrimID[0];
                    uStack_63c = local_640;
                    uStack_638 = local_640;
                    uStack_634 = local_640;
                    uStack_630 = local_640;
                    uStack_62c = local_640;
                    uStack_628 = local_640;
                    uStack_624 = local_640;
                    *(float *)(ray + k * 4 + 0x100) = fVar242;
                    local_c00 = *local_ab0;
                    local_bf0 = *local_ab8;
                    local_b90.valid = (int *)local_c00;
                    local_b90.geometryUserPtr = pGVar3->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = local_740;
                    local_b90.N = 8;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->intersectionFilterN)(&local_b90);
                    }
                    auVar174 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                    auVar257 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                    auVar152._16_16_ = auVar257;
                    auVar152._0_16_ = auVar174;
                    auVar126 = _DAT_01f7b020 & ~auVar152;
                    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0x7f,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0xbf,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar126[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_b90);
                      }
                      auVar174 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                      auVar257 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                      auVar96._16_16_ = auVar257;
                      auVar96._0_16_ = auVar174;
                      auVar126 = _DAT_01f7b020 & ~auVar96;
                      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0xbf,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar126[0x1f] < '\0') {
                        auVar97._0_8_ = auVar174._0_8_ ^ 0xffffffffffffffff;
                        auVar97._8_4_ = auVar174._8_4_ ^ 0xffffffff;
                        auVar97._12_4_ = auVar174._12_4_ ^ 0xffffffff;
                        auVar97._16_4_ = auVar257._0_4_ ^ 0xffffffff;
                        auVar97._20_4_ = auVar257._4_4_ ^ 0xffffffff;
                        auVar97._24_4_ = auVar257._8_4_ ^ 0xffffffff;
                        auVar97._28_4_ = auVar257._12_4_ ^ 0xffffffff;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])local_b90.hit);
                        *(undefined1 (*) [32])(local_b90.ray + 0x180) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0x20));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1a0) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0x40));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1c0) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0x60));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1e0) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0x80));
                        *(undefined1 (*) [32])(local_b90.ray + 0x200) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x220) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x240) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x260) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar97,*(undefined1 (*) [32])
                                                           (local_b90.hit + 0x100));
                        *(undefined1 (*) [32])(local_b90.ray + 0x280) = auVar126;
                        goto LAB_0083cdf7;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar187;
                  }
                }
              }
            }
LAB_0083cdf7:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar300._4_4_ = uVar1;
            auVar300._0_4_ = uVar1;
            auVar300._8_4_ = uVar1;
            auVar300._12_4_ = uVar1;
            auVar300._16_4_ = uVar1;
            auVar300._20_4_ = uVar1;
            auVar300._24_4_ = uVar1;
            auVar300._28_4_ = uVar1;
            auVar365 = ZEXT3264(auVar300);
            auVar126 = vcmpps_avx(_local_8a0,auVar300,2);
            auVar126 = vandps_avx(auVar126,local_4c0);
          }
          auVar98._0_4_ = (float)local_900._0_4_ + (float)local_880._0_4_;
          auVar98._4_4_ = (float)local_900._4_4_ + (float)local_880._4_4_;
          auVar98._8_4_ = fStack_8f8 + fStack_878;
          auVar98._12_4_ = fStack_8f4 + fStack_874;
          auVar98._16_4_ = fStack_8f0 + fStack_870;
          auVar98._20_4_ = fStack_8ec + fStack_86c;
          auVar98._24_4_ = fStack_8e8 + fStack_868;
          auVar98._28_4_ = fStack_8e4 + fStack_864;
          auVar174 = vshufps_avx(auVar365._0_16_,auVar365._0_16_,0);
          auVar132._16_16_ = auVar174;
          auVar132._0_16_ = auVar174;
          auVar126 = vcmpps_avx(auVar98,auVar132,2);
          _local_8a0 = vandps_avx(auVar126,local_8c0);
          auVar99._8_4_ = 3;
          auVar99._0_8_ = 0x300000003;
          auVar99._12_4_ = 3;
          auVar99._16_4_ = 3;
          auVar99._20_4_ = 3;
          auVar99._24_4_ = 3;
          auVar99._28_4_ = 3;
          auVar133._8_4_ = 2;
          auVar133._0_8_ = 0x200000002;
          auVar133._12_4_ = 2;
          auVar133._16_4_ = 2;
          auVar133._20_4_ = 2;
          auVar133._24_4_ = 2;
          auVar133._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar133,auVar99,local_7c0);
          auVar174 = vpcmpgtd_avx(auVar126._16_16_,local_800);
          auVar257 = vpshufd_avx(local_7e0._0_16_,0);
          auVar257 = vpcmpgtd_avx(auVar126._0_16_,auVar257);
          auVar134._16_16_ = auVar174;
          auVar134._0_16_ = auVar257;
          local_8c0 = vblendps_avx(ZEXT1632(auVar257),auVar134,0xf0);
          auVar126 = vandnps_avx(local_8c0,_local_8a0);
          local_840 = _local_460;
          local_880._4_4_ = (float)local_900._4_4_ + (float)local_460._4_4_;
          local_880._0_4_ = (float)local_900._0_4_ + (float)local_460._0_4_;
          fStack_878 = fStack_8f8 + fStack_458;
          fStack_874 = fStack_8f4 + fStack_454;
          fStack_870 = fStack_8f0 + fStack_450;
          fStack_86c = fStack_8ec + fStack_44c;
          fStack_868 = fStack_8e8 + fStack_448;
          fStack_864 = fStack_8e4 + fStack_444;
          auVar310 = ZEXT3264(local_a60);
          auVar323 = ZEXT3264(local_b20);
          auVar267 = ZEXT3264(local_9e0);
          while( true ) {
            local_4e0 = auVar126;
            if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0x7f,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar126 >> 0xbf,0) == '\0') &&
                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar126[0x1f]) break;
            auVar135._8_4_ = 0x7f800000;
            auVar135._0_8_ = 0x7f8000007f800000;
            auVar135._12_4_ = 0x7f800000;
            auVar135._16_4_ = 0x7f800000;
            auVar135._20_4_ = 0x7f800000;
            auVar135._24_4_ = 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar261 = vblendvps_avx(auVar135,local_840,auVar126);
            auVar87 = vshufps_avx(auVar261,auVar261,0xb1);
            auVar87 = vminps_avx(auVar261,auVar87);
            auVar322 = vshufpd_avx(auVar87,auVar87,5);
            auVar87 = vminps_avx(auVar87,auVar322);
            auVar322 = vperm2f128_avx(auVar87,auVar87,1);
            auVar87 = vminps_avx(auVar87,auVar322);
            auVar261 = vcmpps_avx(auVar261,auVar87,0);
            auVar87 = auVar126 & auVar261;
            if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar87 >> 0x7f,0) != '\0') ||
                  (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar87 >> 0xbf,0) != '\0') ||
                (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar87[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar261,auVar126);
            }
            uVar66 = vmovmskps_avx(auVar126);
            uVar70 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar68 = (ulong)uVar70;
            *(undefined4 *)(local_4e0 + uVar68 * 4) = 0;
            fVar167 = local_1c0[uVar68];
            uVar70 = *(uint *)(local_440 + uVar68 * 4);
            fVar242 = auVar13._0_4_;
            if ((float)local_a40._0_4_ < 0.0) {
              fVar242 = sqrtf((float)local_a40._0_4_);
              auVar267 = ZEXT3264(local_9e0);
              auVar323 = ZEXT3264(local_b20);
              auVar310 = ZEXT3264(local_a60);
            }
            auVar257 = vminps_avx(_local_ba0,_local_bc0);
            auVar174 = vmaxps_avx(_local_ba0,_local_bc0);
            auVar14 = vminps_avx(_local_bb0,_local_bd0);
            auVar80 = vminps_avx(auVar257,auVar14);
            auVar257 = vmaxps_avx(_local_bb0,_local_bd0);
            auVar14 = vmaxps_avx(auVar174,auVar257);
            auVar177._8_4_ = 0x7fffffff;
            auVar177._0_8_ = 0x7fffffff7fffffff;
            auVar177._12_4_ = 0x7fffffff;
            auVar174 = vandps_avx(auVar80,auVar177);
            auVar257 = vandps_avx(auVar14,auVar177);
            auVar174 = vmaxps_avx(auVar174,auVar257);
            auVar257 = vmovshdup_avx(auVar174);
            auVar257 = vmaxss_avx(auVar257,auVar174);
            auVar174 = vshufpd_avx(auVar174,auVar174,1);
            auVar174 = vmaxss_avx(auVar174,auVar257);
            local_b40._0_4_ = auVar174._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar242 * 1.9073486e-06;
            local_860._0_16_ = vshufps_avx(auVar14,auVar14,0xff);
            auVar174 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar167),0x10);
            auVar365 = ZEXT1664(auVar174);
            lVar67 = 5;
            do {
              do {
                bVar73 = lVar67 == 0;
                lVar67 = lVar67 + -1;
                if (bVar73) goto LAB_0083d9c6;
                auVar257 = auVar365._0_16_;
                auVar174 = vmovshdup_avx(auVar257);
                fVar192 = auVar174._0_4_;
                fVar188 = 1.0 - fVar192;
                auVar174 = vshufps_avx(auVar257,auVar257,0x55);
                fVar167 = auVar174._0_4_;
                fVar242 = auVar174._4_4_;
                fVar187 = auVar174._8_4_;
                fVar244 = auVar174._12_4_;
                auVar174 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
                fVar246 = auVar174._0_4_;
                fVar189 = auVar174._4_4_;
                fVar251 = auVar174._8_4_;
                fVar268 = auVar174._12_4_;
                fVar272 = (float)local_bb0._0_4_ * fVar167 + (float)local_bc0._0_4_ * fVar246;
                fVar276 = (float)local_bb0._4_4_ * fVar242 + (float)local_bc0._4_4_ * fVar189;
                fVar190 = fStack_ba8 * fVar187 + fStack_bb8 * fVar251;
                fVar191 = fStack_ba4 * fVar244 + fStack_bb4 * fVar268;
                auVar229._0_4_ =
                     fVar246 * ((float)local_bc0._0_4_ * fVar167 + fVar246 * (float)local_ba0._0_4_)
                     + fVar167 * fVar272;
                auVar229._4_4_ =
                     fVar189 * ((float)local_bc0._4_4_ * fVar242 + fVar189 * (float)local_ba0._4_4_)
                     + fVar242 * fVar276;
                auVar229._8_4_ =
                     fVar251 * (fStack_bb8 * fVar187 + fVar251 * fStack_b98) + fVar187 * fVar190;
                auVar229._12_4_ =
                     fVar268 * (fStack_bb4 * fVar244 + fVar268 * fStack_b94) + fVar244 * fVar191;
                auVar178._0_4_ =
                     fVar246 * fVar272 +
                     fVar167 * (fVar167 * (float)local_bd0._0_4_ + (float)local_bb0._0_4_ * fVar246)
                ;
                auVar178._4_4_ =
                     fVar189 * fVar276 +
                     fVar242 * (fVar242 * (float)local_bd0._4_4_ + (float)local_bb0._4_4_ * fVar189)
                ;
                auVar178._8_4_ =
                     fVar251 * fVar190 + fVar187 * (fVar187 * fStack_bc8 + fStack_ba8 * fVar251);
                auVar178._12_4_ =
                     fVar268 * fVar191 + fVar244 * (fVar244 * fStack_bc4 + fStack_ba4 * fVar268);
                auVar174 = vshufps_avx(auVar257,auVar257,0);
                auVar121._0_4_ = auVar174._0_4_ * (float)local_a30._0_4_ + 0.0;
                auVar121._4_4_ = auVar174._4_4_ * (float)local_a30._4_4_ + 0.0;
                auVar121._8_4_ = auVar174._8_4_ * fStack_a28 + 0.0;
                auVar121._12_4_ = auVar174._12_4_ * fStack_a24 + 0.0;
                auVar83._0_4_ = fVar246 * auVar229._0_4_ + fVar167 * auVar178._0_4_;
                auVar83._4_4_ = fVar189 * auVar229._4_4_ + fVar242 * auVar178._4_4_;
                auVar83._8_4_ = fVar251 * auVar229._8_4_ + fVar187 * auVar178._8_4_;
                auVar83._12_4_ = fVar268 * auVar229._12_4_ + fVar244 * auVar178._12_4_;
                local_9c0._0_16_ = auVar83;
                auVar174 = vsubps_avx(auVar121,auVar83);
                _local_b60 = auVar174;
                auVar174 = vdpps_avx(auVar174,auVar174,0x7f);
                fVar167 = auVar174._0_4_;
                if (fVar167 < 0.0) {
                  local_ae0._0_16_ = auVar229;
                  fVar242 = sqrtf(fVar167);
                  auVar365 = ZEXT1664(auVar257);
                  auVar229 = local_ae0._0_16_;
                }
                else {
                  auVar14 = vsqrtss_avx(auVar174,auVar174);
                  fVar242 = auVar14._0_4_;
                }
                auVar14 = vsubps_avx(auVar178,auVar229);
                auVar259._0_4_ = auVar14._0_4_ * 3.0;
                auVar259._4_4_ = auVar14._4_4_ * 3.0;
                auVar259._8_4_ = auVar14._8_4_ * 3.0;
                auVar259._12_4_ = auVar14._12_4_ * 3.0;
                auVar14 = vshufps_avx(ZEXT416((uint)(fVar192 * 6.0)),ZEXT416((uint)(fVar192 * 6.0)),
                                      0);
                auVar80 = ZEXT416((uint)((fVar188 - (fVar192 + fVar192)) * 6.0));
                auVar77 = vshufps_avx(auVar80,auVar80,0);
                auVar80 = ZEXT416((uint)((fVar192 - (fVar188 + fVar188)) * 6.0));
                auVar113 = vshufps_avx(auVar80,auVar80,0);
                auVar76 = vshufps_avx(ZEXT416((uint)(fVar188 * 6.0)),ZEXT416((uint)(fVar188 * 6.0)),
                                      0);
                auVar80 = vdpps_avx(auVar259,auVar259,0x7f);
                auVar122._0_4_ =
                     auVar76._0_4_ * (float)local_ba0._0_4_ +
                     auVar113._0_4_ * (float)local_bc0._0_4_ +
                     auVar14._0_4_ * (float)local_bd0._0_4_ + auVar77._0_4_ * (float)local_bb0._0_4_
                ;
                auVar122._4_4_ =
                     auVar76._4_4_ * (float)local_ba0._4_4_ +
                     auVar113._4_4_ * (float)local_bc0._4_4_ +
                     auVar14._4_4_ * (float)local_bd0._4_4_ + auVar77._4_4_ * (float)local_bb0._4_4_
                ;
                auVar122._8_4_ =
                     auVar76._8_4_ * fStack_b98 +
                     auVar113._8_4_ * fStack_bb8 +
                     auVar14._8_4_ * fStack_bc8 + auVar77._8_4_ * fStack_ba8;
                auVar122._12_4_ =
                     auVar76._12_4_ * fStack_b94 +
                     auVar113._12_4_ * fStack_bb4 +
                     auVar14._12_4_ * fStack_bc4 + auVar77._12_4_ * fStack_ba4;
                auVar14 = vblendps_avx(auVar80,_DAT_01f45a50,0xe);
                auVar77 = vrsqrtss_avx(auVar14,auVar14);
                fVar244 = auVar77._0_4_;
                fVar187 = auVar80._0_4_;
                auVar77 = vdpps_avx(auVar259,auVar122,0x7f);
                auVar113 = vshufps_avx(auVar80,auVar80,0);
                auVar123._0_4_ = auVar122._0_4_ * auVar113._0_4_;
                auVar123._4_4_ = auVar122._4_4_ * auVar113._4_4_;
                auVar123._8_4_ = auVar122._8_4_ * auVar113._8_4_;
                auVar123._12_4_ = auVar122._12_4_ * auVar113._12_4_;
                auVar77 = vshufps_avx(auVar77,auVar77,0);
                auVar202._0_4_ = auVar259._0_4_ * auVar77._0_4_;
                auVar202._4_4_ = auVar259._4_4_ * auVar77._4_4_;
                auVar202._8_4_ = auVar259._8_4_ * auVar77._8_4_;
                auVar202._12_4_ = auVar259._12_4_ * auVar77._12_4_;
                auVar76 = vsubps_avx(auVar123,auVar202);
                auVar77 = vrcpss_avx(auVar14,auVar14);
                auVar14 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                     ZEXT416((uint)(auVar365._0_4_ * (float)local_960._0_4_)));
                auVar77 = ZEXT416((uint)(auVar77._0_4_ * (2.0 - fVar187 * auVar77._0_4_)));
                auVar77 = vshufps_avx(auVar77,auVar77,0);
                uVar68 = CONCAT44(auVar259._4_4_,auVar259._0_4_);
                auVar298._0_8_ = uVar68 ^ 0x8000000080000000;
                auVar298._8_4_ = -auVar259._8_4_;
                auVar298._12_4_ = -auVar259._12_4_;
                auVar113 = ZEXT416((uint)(fVar244 * 1.5 +
                                         fVar187 * -0.5 * fVar244 * fVar244 * fVar244));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar179._0_4_ = auVar113._0_4_ * auVar76._0_4_ * auVar77._0_4_;
                auVar179._4_4_ = auVar113._4_4_ * auVar76._4_4_ * auVar77._4_4_;
                auVar179._8_4_ = auVar113._8_4_ * auVar76._8_4_ * auVar77._8_4_;
                auVar179._12_4_ = auVar113._12_4_ * auVar76._12_4_ * auVar77._12_4_;
                local_b00._0_4_ = auVar259._0_4_ * auVar113._0_4_;
                local_b00._4_4_ = auVar259._4_4_ * auVar113._4_4_;
                local_b00._8_4_ = auVar259._8_4_ * auVar113._8_4_;
                local_b00._12_4_ = auVar259._12_4_ * auVar113._12_4_;
                if (fVar187 < 0.0) {
                  local_ae0._0_4_ = fVar242;
                  local_a80._0_16_ = auVar179;
                  fVar187 = sqrtf(fVar187);
                  auVar179 = local_a80._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar187 = auVar80._0_4_;
                  local_ae0._0_4_ = fVar242;
                }
                auVar80 = vdpps_avx(_local_b60,local_b00._0_16_,0x7f);
                fVar242 = ((float)local_b40._0_4_ / fVar187) * ((float)local_ae0._0_4_ + 1.0) +
                          auVar14._0_4_ + (float)local_ae0._0_4_ * (float)local_b40._0_4_;
                auVar77 = vdpps_avx(auVar298,local_b00._0_16_,0x7f);
                auVar113 = vdpps_avx(_local_b60,auVar179,0x7f);
                auVar76 = vdpps_avx(_local_a30,local_b00._0_16_,0x7f);
                auVar112 = vdpps_avx(_local_b60,auVar298,0x7f);
                fVar187 = auVar77._0_4_ + auVar113._0_4_;
                fVar244 = auVar80._0_4_;
                auVar84._0_4_ = fVar244 * fVar244;
                auVar84._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar84._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar84._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar113 = vsubps_avx(auVar174,auVar84);
                local_b00._0_16_ = ZEXT416((uint)fVar187);
                auVar77 = vdpps_avx(_local_b60,_local_a30,0x7f);
                fVar188 = auVar112._0_4_ - fVar244 * fVar187;
                local_ae0._0_16_ = auVar80;
                fVar244 = auVar77._0_4_ - fVar244 * auVar76._0_4_;
                auVar80 = vrsqrtss_avx(auVar113,auVar113);
                fVar246 = auVar113._0_4_;
                fVar187 = auVar80._0_4_;
                fVar187 = fVar187 * 1.5 + fVar246 * -0.5 * fVar187 * fVar187 * fVar187;
                if (fVar246 < 0.0) {
                  local_a80._0_16_ = auVar76;
                  local_980._0_4_ = fVar188;
                  local_a00._0_4_ = fVar244;
                  local_a20._0_4_ = fVar187;
                  fVar246 = sqrtf(fVar246);
                  fVar187 = (float)local_a20._0_4_;
                  fVar188 = (float)local_980._0_4_;
                  fVar244 = (float)local_a00._0_4_;
                  auVar76 = local_a80._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar113,auVar113);
                  fVar246 = auVar80._0_4_;
                }
                auVar310 = ZEXT3264(local_a60);
                auVar323 = ZEXT3264(local_b20);
                auVar85 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar112 = vshufps_avx(auVar259,auVar259,0xff);
                fVar188 = fVar188 * fVar187 - auVar112._0_4_;
                auVar203._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar230._0_4_ = -fVar188;
                auVar230._4_4_ = 0x80000000;
                auVar230._8_4_ = 0x80000000;
                auVar230._12_4_ = 0x80000000;
                auVar80 = vinsertps_avx(auVar230,ZEXT416((uint)(fVar244 * fVar187)),0x1c);
                auVar113 = vmovsldup_avx(ZEXT416((uint)(local_b00._0_4_ * fVar244 * fVar187 -
                                                       auVar76._0_4_ * fVar188)));
                auVar80 = vdivps_avx(auVar80,auVar113);
                auVar77 = vinsertps_avx(local_b00._0_16_,auVar203,0x10);
                auVar77 = vdivps_avx(auVar77,auVar113);
                auVar113 = vmovsldup_avx(local_ae0._0_16_);
                auVar85 = ZEXT416((uint)(fVar246 - auVar85._0_4_));
                auVar76 = vmovsldup_avx(auVar85);
                auVar145._0_4_ = auVar113._0_4_ * auVar80._0_4_ + auVar76._0_4_ * auVar77._0_4_;
                auVar145._4_4_ = auVar113._4_4_ * auVar80._4_4_ + auVar76._4_4_ * auVar77._4_4_;
                auVar145._8_4_ = auVar113._8_4_ * auVar80._8_4_ + auVar76._8_4_ * auVar77._8_4_;
                auVar145._12_4_ = auVar113._12_4_ * auVar80._12_4_ + auVar76._12_4_ * auVar77._12_4_
                ;
                auVar80 = vsubps_avx(auVar257,auVar145);
                auVar365 = ZEXT1664(auVar80);
                auVar146._8_4_ = 0x7fffffff;
                auVar146._0_8_ = 0x7fffffff7fffffff;
                auVar146._12_4_ = 0x7fffffff;
                auVar257 = vandps_avx(local_ae0._0_16_,auVar146);
                auVar267 = ZEXT3264(local_9e0);
              } while (fVar242 <= auVar257._0_4_);
              auVar180._8_4_ = 0x7fffffff;
              auVar180._0_8_ = 0x7fffffff7fffffff;
              auVar180._12_4_ = 0x7fffffff;
              auVar257 = vandps_avx(auVar85,auVar180);
            } while ((float)local_860._0_4_ * 1.9073486e-06 + auVar14._0_4_ + fVar242 <=
                     auVar257._0_4_);
            fVar242 = auVar80._0_4_ + (float)local_940._0_4_;
            if ((fVar221 <= fVar242) &&
               (fVar187 = *(float *)(ray + k * 4 + 0x100), fVar242 <= fVar187)) {
              auVar257 = vmovshdup_avx(auVar80);
              fVar244 = auVar257._0_4_;
              if ((0.0 <= fVar244) && (fVar244 <= 1.0)) {
                auVar174 = vrsqrtss_avx(auVar174,auVar174);
                fVar188 = auVar174._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar65].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar174 = ZEXT416((uint)(fVar188 * 1.5 +
                                           fVar167 * -0.5 * fVar188 * fVar188 * fVar188));
                  auVar174 = vshufps_avx(auVar174,auVar174,0);
                  auVar181._0_4_ = auVar174._0_4_ * (float)local_b60._0_4_;
                  auVar181._4_4_ = auVar174._4_4_ * (float)local_b60._4_4_;
                  auVar181._8_4_ = auVar174._8_4_ * fStack_b58;
                  auVar181._12_4_ = auVar174._12_4_ * fStack_b54;
                  auVar124._0_4_ = auVar259._0_4_ + auVar112._0_4_ * auVar181._0_4_;
                  auVar124._4_4_ = auVar259._4_4_ + auVar112._4_4_ * auVar181._4_4_;
                  auVar124._8_4_ = auVar259._8_4_ + auVar112._8_4_ * auVar181._8_4_;
                  auVar124._12_4_ = auVar259._12_4_ + auVar112._12_4_ * auVar181._12_4_;
                  auVar174 = vshufps_avx(auVar181,auVar181,0xc9);
                  auVar257 = vshufps_avx(auVar259,auVar259,0xc9);
                  auVar182._0_4_ = auVar257._0_4_ * auVar181._0_4_;
                  auVar182._4_4_ = auVar257._4_4_ * auVar181._4_4_;
                  auVar182._8_4_ = auVar257._8_4_ * auVar181._8_4_;
                  auVar182._12_4_ = auVar257._12_4_ * auVar181._12_4_;
                  auVar204._0_4_ = auVar259._0_4_ * auVar174._0_4_;
                  auVar204._4_4_ = auVar259._4_4_ * auVar174._4_4_;
                  auVar204._8_4_ = auVar259._8_4_ * auVar174._8_4_;
                  auVar204._12_4_ = auVar259._12_4_ * auVar174._12_4_;
                  auVar14 = vsubps_avx(auVar204,auVar182);
                  auVar174 = vshufps_avx(auVar14,auVar14,0xc9);
                  auVar257 = vshufps_avx(auVar124,auVar124,0xc9);
                  auVar205._0_4_ = auVar257._0_4_ * auVar174._0_4_;
                  auVar205._4_4_ = auVar257._4_4_ * auVar174._4_4_;
                  auVar205._8_4_ = auVar257._8_4_ * auVar174._8_4_;
                  auVar205._12_4_ = auVar257._12_4_ * auVar174._12_4_;
                  auVar174 = vshufps_avx(auVar14,auVar14,0xd2);
                  auVar125._0_4_ = auVar124._0_4_ * auVar174._0_4_;
                  auVar125._4_4_ = auVar124._4_4_ * auVar174._4_4_;
                  auVar125._8_4_ = auVar124._8_4_ * auVar174._8_4_;
                  auVar125._12_4_ = auVar124._12_4_ * auVar174._12_4_;
                  auVar174 = vsubps_avx(auVar205,auVar125);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar242;
                    uVar1 = vextractps_avx(auVar174,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar1;
                    uVar1 = vextractps_avx(auVar174,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar1;
                    *(int *)(ray + k * 4 + 0x1c0) = auVar174._0_4_;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar244;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_920;
                    *(uint *)(ray + k * 4 + 0x240) = uVar65;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar6 = context->user;
                    auStack_6d0 = vshufps_avx(auVar80,auVar80,0x55);
                    auStack_730 = vshufps_avx(auVar174,auVar174,0x55);
                    auStack_710 = vshufps_avx(auVar174,auVar174,0xaa);
                    auStack_6f0 = vshufps_avx(auVar174,auVar174,0);
                    local_740 = (RTCHitN  [16])auStack_730;
                    local_720 = auStack_710;
                    local_700 = auStack_6f0;
                    local_6e0 = auStack_6d0;
                    local_6c0 = ZEXT832(0) << 0x20;
                    local_6a0 = local_5e0._0_8_;
                    uStack_698 = local_5e0._8_8_;
                    uStack_690 = local_5e0._16_8_;
                    uStack_688 = local_5e0._24_8_;
                    local_680 = local_5c0;
                    auVar126 = vcmpps_avx(local_5c0,local_5c0,0xf);
                    local_aa8[1] = auVar126;
                    *local_aa8 = auVar126;
                    local_660 = pRVar6->instID[0];
                    uStack_65c = local_660;
                    uStack_658 = local_660;
                    uStack_654 = local_660;
                    uStack_650 = local_660;
                    uStack_64c = local_660;
                    uStack_648 = local_660;
                    uStack_644 = local_660;
                    local_640 = pRVar6->instPrimID[0];
                    uStack_63c = local_640;
                    uStack_638 = local_640;
                    uStack_634 = local_640;
                    uStack_630 = local_640;
                    uStack_62c = local_640;
                    uStack_628 = local_640;
                    uStack_624 = local_640;
                    *(float *)(ray + k * 4 + 0x100) = fVar242;
                    local_c00 = *local_ab0;
                    local_bf0 = *local_ab8;
                    local_b90.valid = (int *)local_c00;
                    local_b90.geometryUserPtr = pGVar3->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = local_740;
                    local_b90.N = 8;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->intersectionFilterN)(&local_b90);
                      auVar267 = ZEXT3264(local_9e0);
                      auVar323 = ZEXT3264(local_b20);
                      auVar310 = ZEXT3264(local_a60);
                    }
                    auVar174 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                    auVar257 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                    auVar153._16_16_ = auVar257;
                    auVar153._0_16_ = auVar174;
                    auVar126 = _DAT_01f7b020 & ~auVar153;
                    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0x7f,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0xbf,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar126[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_b90);
                        auVar267 = ZEXT3264(local_9e0);
                        auVar323 = ZEXT3264(local_b20);
                        auVar310 = ZEXT3264(local_a60);
                      }
                      auVar174 = vpcmpeqd_avx(local_c00,ZEXT816(0) << 0x40);
                      auVar257 = vpcmpeqd_avx(local_bf0,ZEXT816(0) << 0x40);
                      auVar100._16_16_ = auVar257;
                      auVar100._0_16_ = auVar174;
                      auVar126 = _DAT_01f7b020 & ~auVar100;
                      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar126 >> 0xbf,0) != '\0') ||
                          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar126[0x1f] < '\0') {
                        auVar101._0_8_ = auVar174._0_8_ ^ 0xffffffffffffffff;
                        auVar101._8_4_ = auVar174._8_4_ ^ 0xffffffff;
                        auVar101._12_4_ = auVar174._12_4_ ^ 0xffffffff;
                        auVar101._16_4_ = auVar257._0_4_ ^ 0xffffffff;
                        auVar101._20_4_ = auVar257._4_4_ ^ 0xffffffff;
                        auVar101._24_4_ = auVar257._8_4_ ^ 0xffffffff;
                        auVar101._28_4_ = auVar257._12_4_ ^ 0xffffffff;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])local_b90.hit);
                        *(undefined1 (*) [32])(local_b90.ray + 0x180) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x20));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1a0) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x40));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1c0) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x60));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1e0) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x80));
                        *(undefined1 (*) [32])(local_b90.ray + 0x200) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x220) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x240) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x260) = auVar126;
                        auVar126 = vmaskmovps_avx(auVar101,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x100));
                        *(undefined1 (*) [32])(local_b90.ray + 0x280) = auVar126;
                        goto LAB_0083d9c6;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar187;
                  }
                }
              }
            }
LAB_0083d9c6:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar301._4_4_ = uVar1;
            auVar301._0_4_ = uVar1;
            auVar301._8_4_ = uVar1;
            auVar301._12_4_ = uVar1;
            auVar301._16_4_ = uVar1;
            auVar301._20_4_ = uVar1;
            auVar301._24_4_ = uVar1;
            auVar301._28_4_ = uVar1;
            auVar365 = ZEXT3264(auVar301);
            auVar126 = vcmpps_avx(_local_880,auVar301,2);
            auVar126 = vandps_avx(auVar126,local_4e0);
          }
          auVar126 = vandps_avx(local_7a0,local_780);
          auVar261 = vandps_avx(local_8c0,_local_8a0);
          auVar154._0_4_ = (float)local_900._0_4_ + local_4a0._0_4_;
          auVar154._4_4_ = (float)local_900._4_4_ + local_4a0._4_4_;
          auVar154._8_4_ = fStack_8f8 + local_4a0._8_4_;
          auVar154._12_4_ = fStack_8f4 + local_4a0._12_4_;
          auVar154._16_4_ = fStack_8f0 + local_4a0._16_4_;
          auVar154._20_4_ = fStack_8ec + local_4a0._20_4_;
          auVar154._24_4_ = fStack_8e8 + local_4a0._24_4_;
          auVar154._28_4_ = fStack_8e4 + local_4a0._28_4_;
          auVar174 = vshufps_avx(auVar365._0_16_,auVar365._0_16_,0);
          auVar214._16_16_ = auVar174;
          auVar214._0_16_ = auVar174;
          auVar87 = vcmpps_avx(auVar154,auVar214,2);
          auVar126 = vandps_avx(auVar87,auVar126);
          auVar240._0_4_ = (float)local_900._0_4_ + local_460._0_4_;
          auVar240._4_4_ = (float)local_900._4_4_ + local_460._4_4_;
          auVar240._8_4_ = fStack_8f8 + local_460._8_4_;
          auVar240._12_4_ = fStack_8f4 + local_460._12_4_;
          auVar240._16_4_ = fStack_8f0 + local_460._16_4_;
          auVar240._20_4_ = fStack_8ec + local_460._20_4_;
          auVar240._24_4_ = fStack_8e8 + local_460._24_4_;
          auVar240._28_4_ = fStack_8e4 + local_460._28_4_;
          auVar87 = vcmpps_avx(auVar240,auVar214,2);
          auVar261 = vandps_avx(auVar87,auVar261);
          auVar261 = vorps_avx(auVar126,auVar261);
          if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar261 >> 0x7f,0) != '\0') ||
                (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar261 >> 0xbf,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar261[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar71 * 0x60) = auVar261;
            auVar126 = vblendvps_avx(_local_460,_local_4a0,auVar126);
            *(undefined1 (*) [32])(auStack_160 + uVar71 * 0x60) = auVar126;
            uVar68 = vmovlps_avx(local_750);
            (&uStack_140)[uVar71 * 0xc] = uVar68;
            auStack_138[uVar71 * 0x18] = local_d04 + 1;
            uVar71 = (ulong)((int)uVar71 + 1);
          }
          auVar365 = ZEXT3264(local_9a0);
          fVar140 = (float)local_900._0_4_;
          fVar156 = (float)local_900._4_4_;
          fVar158 = fStack_8f8;
          fVar160 = fStack_8f4;
          fVar162 = fStack_8f0;
          fVar164 = fStack_8ec;
          fVar166 = fStack_8e8;
          fVar254 = fStack_8e4;
          goto LAB_0083c3e0;
        }
      }
      auVar310 = ZEXT3264(local_a60);
      auVar365 = ZEXT3264(local_9a0);
      auVar323 = ZEXT3264(local_b20);
      auVar267 = ZEXT3264(local_9e0);
    }
LAB_0083c3e0:
    while( true ) {
      auVar261 = local_580;
      uVar70 = (uint)uVar71;
      if (uVar70 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar86._4_4_ = uVar1;
        auVar86._0_4_ = uVar1;
        auVar86._8_4_ = uVar1;
        auVar86._12_4_ = uVar1;
        auVar114 = vcmpps_avx(local_760,auVar86,2);
        uVar65 = vmovmskps_avx(auVar114);
        uVar65 = (uint)uVar72 & uVar65;
        goto LAB_0083b26a;
      }
      uVar71 = (ulong)(uVar70 - 1);
      lVar67 = uVar71 * 0x60;
      auVar126 = *(undefined1 (*) [32])(auStack_160 + lVar67);
      auVar93._0_4_ = fVar140 + auVar126._0_4_;
      auVar93._4_4_ = fVar156 + auVar126._4_4_;
      auVar93._8_4_ = fVar158 + auVar126._8_4_;
      auVar93._12_4_ = fVar160 + auVar126._12_4_;
      auVar93._16_4_ = fVar162 + auVar126._16_4_;
      auVar93._20_4_ = fVar164 + auVar126._20_4_;
      auVar93._24_4_ = fVar166 + auVar126._24_4_;
      auVar93._28_4_ = fVar254 + auVar126._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar185._4_4_ = uVar1;
      auVar185._0_4_ = uVar1;
      auVar185._8_4_ = uVar1;
      auVar185._12_4_ = uVar1;
      auVar185._16_4_ = uVar1;
      auVar185._20_4_ = uVar1;
      auVar185._24_4_ = uVar1;
      auVar185._28_4_ = uVar1;
      auVar322 = vcmpps_avx(auVar93,auVar185,2);
      auVar87 = vandps_avx(auVar322,*(undefined1 (*) [32])(auStack_180 + lVar67));
      _local_740 = auVar87;
      auVar322 = *(undefined1 (*) [32])(auStack_180 + lVar67) & auVar322;
      if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar322 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar322 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar322 >> 0x7f,0) != '\0') ||
            (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar322 >> 0xbf,0) != '\0') ||
          (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar322[0x1f] < '\0') break;
      uVar71 = (ulong)(uVar70 - 1);
    }
    auVar150._8_4_ = 0x7f800000;
    auVar150._0_8_ = 0x7f8000007f800000;
    auVar150._12_4_ = 0x7f800000;
    auVar150._16_4_ = 0x7f800000;
    auVar150._20_4_ = 0x7f800000;
    auVar150._24_4_ = 0x7f800000;
    auVar150._28_4_ = 0x7f800000;
    auVar126 = vblendvps_avx(auVar150,auVar126,auVar87);
    auVar322 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar322 = vminps_avx(auVar126,auVar322);
    auVar88 = vshufpd_avx(auVar322,auVar322,5);
    auVar322 = vminps_avx(auVar322,auVar88);
    auVar88 = vperm2f128_avx(auVar322,auVar322,1);
    auVar322 = vminps_avx(auVar322,auVar88);
    auVar126 = vcmpps_avx(auVar126,auVar322,0);
    auVar322 = auVar87 & auVar126;
    if ((((((((auVar322 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar322 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar322 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar322 >> 0x7f,0) != '\0') ||
          (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar322 >> 0xbf,0) != '\0') ||
        (auVar322 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar322[0x1f] < '\0') {
      auVar87 = vandps_avx(auVar126,auVar87);
    }
    auVar115._8_8_ = 0;
    auVar115._0_8_ = (&uStack_140)[uVar71 * 0xc];
    local_d04 = auStack_138[uVar71 * 0x18];
    uVar69 = vmovmskps_avx(auVar87);
    uVar66 = 0;
    if (uVar69 != 0) {
      for (; (uVar69 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
      }
    }
    *(undefined4 *)(local_740 + (ulong)uVar66 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar67) = _local_740;
    uVar69 = uVar70 - 1;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar69 = uVar70;
    }
    auVar174 = vshufps_avx(auVar115,auVar115,0);
    auVar257 = vshufps_avx(auVar115,auVar115,0x55);
    auVar257 = vsubps_avx(auVar257,auVar174);
    local_4a0._4_4_ = auVar174._4_4_ + auVar257._4_4_ * 0.14285715;
    local_4a0._0_4_ = auVar174._0_4_ + auVar257._0_4_ * 0.0;
    fStack_498 = auVar174._8_4_ + auVar257._8_4_ * 0.2857143;
    fStack_494 = auVar174._12_4_ + auVar257._12_4_ * 0.42857146;
    fStack_490 = auVar174._0_4_ + auVar257._0_4_ * 0.5714286;
    fStack_48c = auVar174._4_4_ + auVar257._4_4_ * 0.71428573;
    fStack_488 = auVar174._8_4_ + auVar257._8_4_ * 0.8571429;
    fStack_484 = auVar174._12_4_ + auVar257._12_4_;
    local_750._8_8_ = 0;
    local_750._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar66 * 4);
    uVar71 = (ulong)uVar69;
    auVar322 = auVar323._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }